

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_8x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  int8_t *piVar26;
  longlong lVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  int iVar31;
  undefined7 in_register_00000009;
  long lVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  undefined1 in_XMM11 [16];
  undefined1 in_XMM12 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar145 [16];
  undefined1 in_XMM14 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar146 [16];
  __m128i out [16];
  __m128i in [16];
  int local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  undefined1 local_138 [8];
  undefined8 uStack_130;
  undefined1 local_128 [8];
  undefined8 uStack_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  int local_b8;
  int iStack_b4;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  int local_58;
  undefined4 uStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  
  piVar26 = av1_fwd_txfm_shift_ls[1];
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    iVar33 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar42 = *(undefined1 (*) [16])input;
    auVar43 = *(undefined1 (*) [16])(input + stride);
    auVar44 = *(undefined1 (*) [16])(input + stride * 2);
    auVar45 = *(undefined1 (*) [16])(input + stride * 3);
    auVar46 = *(undefined1 (*) [16])(input + stride * 4);
    auVar47 = *(undefined1 (*) [16])(input + stride * 5);
    auVar48 = *(undefined1 (*) [16])(input + stride * 6);
    auVar70 = pmovsxwd(in_XMM9,auVar42);
    auVar49 = *(undefined1 (*) [16])(input + stride * 7);
    uStack_130 = auVar42._8_8_;
    lVar27 = uStack_130;
    local_138._4_4_ = auVar70._4_4_;
    local_138._0_4_ = auVar70._0_4_ << iVar33;
    uStack_130._4_4_ = auVar42._12_4_;
    uVar28 = uStack_130._4_4_;
    uStack_130._0_4_ = auVar70._8_4_;
    uStack_130._4_4_ = auVar70._12_4_;
    auVar119._8_4_ = auVar42._8_4_;
    auVar119._0_8_ = lVar27;
    auVar119._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar119,auVar119);
    local_128._0_4_ = auVar42._0_4_ << iVar33;
    local_128._4_4_ = auVar42._4_4_;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd((undefined1  [16])_local_128,auVar43);
    local_118._8_8_ = auVar44._8_8_;
    uVar5 = local_118._8_8_;
    local_118._4_4_ = auVar42._4_4_;
    local_118._0_4_ = auVar42._0_4_ << iVar33;
    local_118._12_4_ = auVar44._12_4_;
    uVar28 = local_118._12_4_;
    local_118._8_4_ = auVar42._8_4_;
    local_118._12_4_ = auVar42._12_4_;
    auVar112._8_4_ = auVar43._8_4_;
    auVar112._12_4_ = auVar43._12_4_;
    auVar112._0_8_ = auVar43._8_8_;
    auVar42 = pmovsxwd(auVar112,auVar112);
    local_108._0_4_ = auVar42._0_4_ << iVar33;
    local_108._4_4_ = auVar42._4_4_;
    local_108._8_4_ = auVar42._8_4_;
    local_108._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_108,auVar44);
    local_f8._8_8_ = auVar46._8_8_;
    uVar6 = local_f8._8_8_;
    local_f8._4_4_ = auVar42._4_4_;
    local_f8._0_4_ = auVar42._0_4_ << iVar33;
    local_f8._12_4_ = auVar46._12_4_;
    uVar29 = local_f8._12_4_;
    local_f8._8_4_ = auVar42._8_4_;
    local_f8._12_4_ = auVar42._12_4_;
    auVar98._8_4_ = auVar44._8_4_;
    auVar98._0_8_ = uVar5;
    auVar98._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar98,auVar98);
    local_e8._0_4_ = auVar42._0_4_ << iVar33;
    local_e8._4_4_ = auVar42._4_4_;
    local_e8._8_4_ = auVar42._8_4_;
    local_e8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_e8,auVar45);
    local_d8._0_4_ = auVar42._0_4_ << iVar33;
    local_d8._4_4_ = auVar42._4_4_;
    local_d8._8_4_ = auVar42._8_4_;
    local_d8._12_4_ = auVar42._12_4_;
    auVar43 = pmovsxwd(local_d8,auVar46);
    auVar90._8_4_ = auVar45._8_4_;
    auVar90._12_4_ = auVar45._12_4_;
    auVar90._0_8_ = auVar45._8_8_;
    auVar42 = pmovsxwd(auVar90,auVar90);
    local_c8._4_4_ = auVar42._4_4_;
    local_c8._0_4_ = auVar42._0_4_ << iVar33;
    local_c8._8_4_ = auVar42._8_4_;
    local_c8._12_4_ = auVar42._12_4_;
    iStack_b4 = auVar43._4_4_;
    local_b8 = auVar43._0_4_ << iVar33;
    uStack_b0._0_4_ = auVar43._8_4_;
    uStack_b0._4_4_ = auVar43._12_4_;
    auVar79._8_4_ = auVar46._8_4_;
    auVar79._0_8_ = uVar6;
    auVar79._12_4_ = uVar29;
    auVar42 = pmovsxwd(auVar79,auVar79);
    local_a8._0_4_ = auVar42._0_4_ << iVar33;
    local_a8._4_4_ = auVar42._4_4_;
    local_a8._8_4_ = auVar42._8_4_;
    local_a8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_a8,auVar47);
    local_98._4_4_ = auVar42._4_4_;
    local_98._0_4_ = auVar42._0_4_ << iVar33;
    local_98._8_4_ = auVar42._8_4_;
    local_98._12_4_ = auVar42._12_4_;
    auVar60._8_4_ = auVar47._8_4_;
    auVar60._12_4_ = auVar47._12_4_;
    auVar60._0_8_ = auVar47._8_8_;
    auVar42 = pmovsxwd(auVar60,auVar60);
    local_88._0_4_ = auVar42._0_4_ << iVar33;
    local_88._4_4_ = auVar42._4_4_;
    local_88._8_4_ = auVar42._8_4_;
    local_88._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_88,auVar48);
    local_78._4_4_ = auVar42._4_4_;
    local_78._0_4_ = auVar42._0_4_ << iVar33;
    uStack_70._0_4_ = auVar42._8_4_;
    uStack_70._4_4_ = auVar42._12_4_;
    auVar35._8_4_ = auVar48._8_4_;
    auVar35._12_4_ = auVar48._12_4_;
    auVar35._0_8_ = auVar48._8_8_;
    auVar42 = pmovsxwd(auVar35,auVar35);
    local_68._0_4_ = auVar42._0_4_ << iVar33;
    local_68._4_4_ = auVar42._4_4_;
    local_68._8_4_ = auVar42._8_4_;
    local_68._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_68,auVar49);
    auVar61._0_8_ = auVar49._8_8_;
    auVar61._8_4_ = auVar49._8_4_;
    auVar61._12_4_ = auVar49._12_4_;
    auVar43 = pmovsxwd(auVar61,auVar61);
    uStack_54 = auVar42._4_4_;
    local_58 = auVar42._0_4_ << iVar33;
    iStack_50 = auVar42._8_4_;
    iStack_4c = auVar42._12_4_;
    iStack_44 = auVar43._4_4_;
    local_48 = auVar43._0_4_ << iVar33;
    iStack_40 = auVar43._8_4_;
    iStack_3c = auVar43._12_4_;
    fdct4x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,0xd,2);
    fdct4x8_sse4_1((__m128i *)local_128,(__m128i *)&local_228,0xd,2);
    iVar33 = 1 << (~piVar26[1] & 0x1fU);
    auVar42 = ZEXT416((uint)-(int)piVar26[1]);
    local_238 = local_238 + iVar33 >> auVar42;
    iStack_234 = iStack_234 + iVar33 >> auVar42;
    iStack_230 = iStack_230 + iVar33 >> auVar42;
    iStack_22c = iStack_22c + iVar33 >> auVar42;
    local_228 = local_228 + iVar33 >> auVar42;
    iStack_224 = iStack_224 + iVar33 >> auVar42;
    iStack_220 = iStack_220 + iVar33 >> auVar42;
    iStack_21c = iStack_21c + iVar33 >> auVar42;
    local_218 = local_218 + iVar33 >> auVar42;
    iStack_214 = iStack_214 + iVar33 >> auVar42;
    iStack_210 = iStack_210 + iVar33 >> auVar42;
    iStack_20c = iStack_20c + iVar33 >> auVar42;
    local_208 = local_208 + iVar33 >> auVar42;
    iStack_204 = iStack_204 + iVar33 >> auVar42;
    iStack_200 = iStack_200 + iVar33 >> auVar42;
    iStack_1fc = iStack_1fc + iVar33 >> auVar42;
    local_1f8 = local_1f8 + iVar33 >> auVar42;
    iStack_1f4 = iStack_1f4 + iVar33 >> auVar42;
    iStack_1f0 = iStack_1f0 + iVar33 >> auVar42;
    iStack_1ec = iStack_1ec + iVar33 >> auVar42;
    local_1e8 = local_1e8 + iVar33 >> auVar42;
    iStack_1e4 = iStack_1e4 + iVar33 >> auVar42;
    iStack_1e0 = iStack_1e0 + iVar33 >> auVar42;
    iStack_1dc = iStack_1dc + iVar33 >> auVar42;
    local_1d8 = local_1d8 + iVar33 >> auVar42;
    iStack_1d4 = iStack_1d4 + iVar33 >> auVar42;
    iStack_1d0 = iStack_1d0 + iVar33 >> auVar42;
    iStack_1cc = iStack_1cc + iVar33 >> auVar42;
    local_1c8 = local_1c8 + iVar33 >> auVar42;
    iStack_1c4 = iStack_1c4 + iVar33 >> auVar42;
    iStack_1c0 = iStack_1c0 + iVar33 >> auVar42;
    iStack_1bc = iStack_1bc + iVar33 >> auVar42;
    local_1b8 = local_1b8 + iVar33 >> auVar42;
    iStack_1b4 = iStack_1b4 + iVar33 >> auVar42;
    iStack_1b0 = iStack_1b0 + iVar33 >> auVar42;
    iStack_1ac = iStack_1ac + iVar33 >> auVar42;
    local_1a8 = local_1a8 + iVar33 >> auVar42;
    iStack_1a4 = iStack_1a4 + iVar33 >> auVar42;
    iStack_1a0 = iStack_1a0 + iVar33 >> auVar42;
    iStack_19c = iStack_19c + iVar33 >> auVar42;
    local_198 = local_198 + iVar33 >> auVar42;
    iStack_194 = iStack_194 + iVar33 >> auVar42;
    iStack_190 = iStack_190 + iVar33 >> auVar42;
    iStack_18c = iStack_18c + iVar33 >> auVar42;
    local_188 = local_188 + iVar33 >> auVar42;
    iStack_184 = iStack_184 + iVar33 >> auVar42;
    iStack_180 = iStack_180 + iVar33 >> auVar42;
    iStack_17c = iStack_17c + iVar33 >> auVar42;
    local_178 = local_178 + iVar33 >> auVar42;
    iStack_174 = iStack_174 + iVar33 >> auVar42;
    iStack_170 = iStack_170 + iVar33 >> auVar42;
    iStack_16c = iStack_16c + iVar33 >> auVar42;
    local_168 = local_168 + iVar33 >> auVar42;
    iStack_164 = iStack_164 + iVar33 >> auVar42;
    iStack_160 = iStack_160 + iVar33 >> auVar42;
    iStack_38 = iStack_15c + iVar33 >> auVar42;
    local_158 = local_158 + iVar33 >> auVar42;
    iStack_154 = iStack_154 + iVar33 >> auVar42;
    iStack_150 = iStack_150 + iVar33 >> auVar42;
    iStack_14c = iStack_14c + iVar33 >> auVar42;
    local_148 = iVar33 + local_148 >> auVar42;
    iStack_144 = iVar33 + iStack_144 >> auVar42;
    iStack_140 = iVar33 + iStack_140 >> auVar42;
    iStack_34 = iVar33 + iStack_13c >> auVar42;
    local_138._4_4_ = local_218;
    local_138._0_4_ = local_238;
    uStack_130._4_4_ = local_1d8;
    uStack_130._0_4_ = local_1f8;
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    auVar8._4_8_ = local_f8._8_8_;
    auVar8._0_4_ = iStack_210;
    local_f8._0_8_ = auVar8._0_8_ << 0x20;
    local_f8._8_4_ = iStack_1f0;
    local_f8._12_4_ = iStack_1d0;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0._4_4_ = local_1c8;
    uStack_b0._0_4_ = local_1e8;
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    auVar9._4_8_ = uStack_70;
    auVar9._0_4_ = iStack_200;
    local_78 = auVar9._0_8_ << 0x20;
    uStack_70._0_4_ = iStack_1e0;
    uStack_70._4_4_ = iStack_1c0;
    iStack_50 = iStack_21c;
    iStack_4c = iStack_1fc;
    iStack_44 = iStack_1bc;
    local_48 = iStack_1dc;
    local_128._4_4_ = local_198;
    local_128._0_4_ = local_1b8;
    uStack_120._4_4_ = local_158;
    uStack_120._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_f8._4_4_ = iStack_154;
    local_f8._0_4_ = iStack_174;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    iStack_b4 = iStack_14c;
    local_b8 = iStack_16c;
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_78._4_4_ = iStack_144;
    local_78._0_4_ = iStack_164;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    iStack_40 = iStack_19c;
    iStack_3c = iStack_17c;
    break;
  case 1:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar42 = *(undefined1 (*) [16])input;
    auVar43 = *(undefined1 (*) [16])(input + stride);
    auVar44 = *(undefined1 (*) [16])(input + stride * 2);
    auVar45 = *(undefined1 (*) [16])(input + stride * 3);
    auVar46 = *(undefined1 (*) [16])(input + stride * 4);
    auVar47 = *(undefined1 (*) [16])(input + stride * 5);
    auVar48 = *(undefined1 (*) [16])(input + stride * 6);
    auVar70 = pmovsxwd(in_XMM9,auVar42);
    auVar49 = *(undefined1 (*) [16])(input + stride * 7);
    uStack_130 = auVar42._8_8_;
    lVar27 = uStack_130;
    local_138._4_4_ = auVar70._4_4_;
    local_138._0_4_ = auVar70._0_4_ << local_48;
    uStack_130._4_4_ = auVar42._12_4_;
    uVar28 = uStack_130._4_4_;
    uStack_130._0_4_ = auVar70._8_4_;
    uStack_130._4_4_ = auVar70._12_4_;
    auVar126._8_4_ = auVar42._8_4_;
    auVar126._0_8_ = lVar27;
    auVar126._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar126,auVar126);
    local_128._0_4_ = auVar42._0_4_ << local_48;
    local_128._4_4_ = auVar42._4_4_;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd((undefined1  [16])_local_128,auVar43);
    local_118._8_8_ = auVar44._8_8_;
    uVar5 = local_118._8_8_;
    local_118._4_4_ = auVar42._4_4_;
    local_118._0_4_ = auVar42._0_4_ << local_48;
    local_118._12_4_ = auVar44._12_4_;
    uVar28 = local_118._12_4_;
    local_118._8_4_ = auVar42._8_4_;
    local_118._12_4_ = auVar42._12_4_;
    auVar117._8_4_ = auVar43._8_4_;
    auVar117._12_4_ = auVar43._12_4_;
    auVar117._0_8_ = auVar43._8_8_;
    auVar42 = pmovsxwd(auVar117,auVar117);
    local_108._0_4_ = auVar42._0_4_ << local_48;
    local_108._4_4_ = auVar42._4_4_;
    local_108._8_4_ = auVar42._8_4_;
    local_108._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_108,auVar44);
    local_f8._8_8_ = auVar46._8_8_;
    uVar6 = local_f8._8_8_;
    local_f8._4_4_ = auVar42._4_4_;
    local_f8._0_4_ = auVar42._0_4_ << local_48;
    local_f8._12_4_ = auVar46._12_4_;
    uVar29 = local_f8._12_4_;
    local_f8._8_4_ = auVar42._8_4_;
    local_f8._12_4_ = auVar42._12_4_;
    auVar105._8_4_ = auVar44._8_4_;
    auVar105._0_8_ = uVar5;
    auVar105._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar105,auVar105);
    local_e8._0_4_ = auVar42._0_4_ << local_48;
    local_e8._4_4_ = auVar42._4_4_;
    local_e8._8_4_ = auVar42._8_4_;
    local_e8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_e8,auVar45);
    local_d8._0_4_ = auVar42._0_4_ << local_48;
    local_d8._4_4_ = auVar42._4_4_;
    local_d8._8_4_ = auVar42._8_4_;
    local_d8._12_4_ = auVar42._12_4_;
    auVar43 = pmovsxwd(local_d8,auVar46);
    auVar96._8_4_ = auVar45._8_4_;
    auVar96._12_4_ = auVar45._12_4_;
    auVar96._0_8_ = auVar45._8_8_;
    auVar42 = pmovsxwd(auVar96,auVar96);
    local_c8._4_4_ = auVar42._4_4_;
    local_c8._0_4_ = auVar42._0_4_ << local_48;
    local_c8._8_4_ = auVar42._8_4_;
    local_c8._12_4_ = auVar42._12_4_;
    iStack_b4 = auVar43._4_4_;
    local_b8 = auVar43._0_4_ << local_48;
    uStack_b0._0_4_ = auVar43._8_4_;
    uStack_b0._4_4_ = auVar43._12_4_;
    auVar85._8_4_ = auVar46._8_4_;
    auVar85._0_8_ = uVar6;
    auVar85._12_4_ = uVar29;
    auVar42 = pmovsxwd(auVar85,auVar85);
    local_a8._0_4_ = auVar42._0_4_ << local_48;
    local_a8._4_4_ = auVar42._4_4_;
    local_a8._8_4_ = auVar42._8_4_;
    local_a8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_a8,auVar47);
    local_98._4_4_ = auVar42._4_4_;
    local_98._0_4_ = auVar42._0_4_ << local_48;
    local_98._8_4_ = auVar42._8_4_;
    local_98._12_4_ = auVar42._12_4_;
    auVar73._8_4_ = auVar47._8_4_;
    auVar73._12_4_ = auVar47._12_4_;
    auVar73._0_8_ = auVar47._8_8_;
    auVar42 = pmovsxwd(auVar73,auVar73);
    local_88._0_4_ = auVar42._0_4_ << local_48;
    local_88._4_4_ = auVar42._4_4_;
    local_88._8_4_ = auVar42._8_4_;
    local_88._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_88,auVar48);
    local_78._4_4_ = auVar42._4_4_;
    local_78._0_4_ = auVar42._0_4_ << local_48;
    uStack_70._0_4_ = auVar42._8_4_;
    uStack_70._4_4_ = auVar42._12_4_;
    auVar51._8_4_ = auVar48._8_4_;
    auVar51._12_4_ = auVar48._12_4_;
    auVar51._0_8_ = auVar48._8_8_;
    auVar42 = pmovsxwd(auVar51,auVar51);
    local_68._0_4_ = auVar42._0_4_ << local_48;
    local_68._4_4_ = auVar42._4_4_;
    local_68._8_4_ = auVar42._8_4_;
    local_68._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_68,auVar49);
    auVar74._0_8_ = auVar49._8_8_;
    auVar74._8_4_ = auVar49._8_4_;
    auVar74._12_4_ = auVar49._12_4_;
    auVar43 = pmovsxwd(auVar74,auVar74);
    local_58 = auVar42._0_4_ << local_48;
    uStack_54 = auVar42._4_4_;
    iStack_50 = auVar42._8_4_;
    iStack_4c = auVar42._12_4_;
    local_48 = auVar43._0_4_ << local_48;
    iStack_44 = auVar43._4_4_;
    iStack_40 = auVar43._8_4_;
    iStack_3c = auVar43._12_4_;
    goto LAB_00b36e32;
  case 2:
    iVar33 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar42 = *(undefined1 (*) [16])input;
    auVar43 = *(undefined1 (*) [16])(input + stride);
    auVar44 = *(undefined1 (*) [16])(input + stride * 2);
    auVar45 = *(undefined1 (*) [16])(input + stride * 3);
    auVar46 = *(undefined1 (*) [16])(input + stride * 4);
    auVar47 = *(undefined1 (*) [16])(input + stride * 5);
    auVar48 = *(undefined1 (*) [16])(input + stride * 6);
    auVar70 = pmovsxwd(in_XMM9,auVar42);
    auVar49 = *(undefined1 (*) [16])(input + stride * 7);
    uStack_130 = auVar42._8_8_;
    lVar27 = uStack_130;
    local_138._4_4_ = auVar70._4_4_;
    local_138._0_4_ = auVar70._0_4_ << iVar33;
    uStack_130._4_4_ = auVar42._12_4_;
    uVar28 = uStack_130._4_4_;
    uStack_130._0_4_ = auVar70._8_4_;
    uStack_130._4_4_ = auVar70._12_4_;
    auVar123._8_4_ = auVar42._8_4_;
    auVar123._0_8_ = lVar27;
    auVar123._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar123,auVar123);
    local_128._0_4_ = auVar42._0_4_ << iVar33;
    local_128._4_4_ = auVar42._4_4_;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd((undefined1  [16])_local_128,auVar43);
    local_118._8_8_ = auVar44._8_8_;
    uVar5 = local_118._8_8_;
    local_118._4_4_ = auVar42._4_4_;
    local_118._0_4_ = auVar42._0_4_ << iVar33;
    local_118._12_4_ = auVar44._12_4_;
    uVar28 = local_118._12_4_;
    local_118._8_4_ = auVar42._8_4_;
    local_118._12_4_ = auVar42._12_4_;
    auVar114._8_4_ = auVar43._8_4_;
    auVar114._12_4_ = auVar43._12_4_;
    auVar114._0_8_ = auVar43._8_8_;
    auVar42 = pmovsxwd(auVar114,auVar114);
    local_108._0_4_ = auVar42._0_4_ << iVar33;
    local_108._4_4_ = auVar42._4_4_;
    local_108._8_4_ = auVar42._8_4_;
    local_108._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_108,auVar44);
    local_f8._8_8_ = auVar46._8_8_;
    uVar6 = local_f8._8_8_;
    local_f8._4_4_ = auVar42._4_4_;
    local_f8._0_4_ = auVar42._0_4_ << iVar33;
    local_f8._12_4_ = auVar46._12_4_;
    uVar29 = local_f8._12_4_;
    local_f8._8_4_ = auVar42._8_4_;
    local_f8._12_4_ = auVar42._12_4_;
    auVar102._8_4_ = auVar44._8_4_;
    auVar102._0_8_ = uVar5;
    auVar102._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar102,auVar102);
    local_e8._0_4_ = auVar42._0_4_ << iVar33;
    local_e8._4_4_ = auVar42._4_4_;
    local_e8._8_4_ = auVar42._8_4_;
    local_e8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_e8,auVar45);
    local_d8._0_4_ = auVar42._0_4_ << iVar33;
    local_d8._4_4_ = auVar42._4_4_;
    local_d8._8_4_ = auVar42._8_4_;
    local_d8._12_4_ = auVar42._12_4_;
    auVar43 = pmovsxwd(local_d8,auVar46);
    auVar93._8_4_ = auVar45._8_4_;
    auVar93._12_4_ = auVar45._12_4_;
    auVar93._0_8_ = auVar45._8_8_;
    auVar42 = pmovsxwd(auVar93,auVar93);
    local_c8._4_4_ = auVar42._4_4_;
    local_c8._0_4_ = auVar42._0_4_ << iVar33;
    local_c8._8_4_ = auVar42._8_4_;
    local_c8._12_4_ = auVar42._12_4_;
    iStack_b4 = auVar43._4_4_;
    local_b8 = auVar43._0_4_ << iVar33;
    uStack_b0._0_4_ = auVar43._8_4_;
    uStack_b0._4_4_ = auVar43._12_4_;
    auVar83._8_4_ = auVar46._8_4_;
    auVar83._0_8_ = uVar6;
    auVar83._12_4_ = uVar29;
    auVar42 = pmovsxwd(auVar83,auVar83);
    local_a8._0_4_ = auVar42._0_4_ << iVar33;
    local_a8._4_4_ = auVar42._4_4_;
    local_a8._8_4_ = auVar42._8_4_;
    local_a8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_a8,auVar47);
    local_98._4_4_ = auVar42._4_4_;
    local_98._0_4_ = auVar42._0_4_ << iVar33;
    local_98._8_4_ = auVar42._8_4_;
    local_98._12_4_ = auVar42._12_4_;
    auVar68._8_4_ = auVar47._8_4_;
    auVar68._12_4_ = auVar47._12_4_;
    auVar68._0_8_ = auVar47._8_8_;
    auVar42 = pmovsxwd(auVar68,auVar68);
    local_88._0_4_ = auVar42._0_4_ << iVar33;
    local_88._4_4_ = auVar42._4_4_;
    local_88._8_4_ = auVar42._8_4_;
    local_88._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_88,auVar48);
    local_78._4_4_ = auVar42._4_4_;
    local_78._0_4_ = auVar42._0_4_ << iVar33;
    uStack_70._0_4_ = auVar42._8_4_;
    uStack_70._4_4_ = auVar42._12_4_;
    auVar41._8_4_ = auVar48._8_4_;
    auVar41._12_4_ = auVar48._12_4_;
    auVar41._0_8_ = auVar48._8_8_;
    auVar42 = pmovsxwd(auVar41,auVar41);
    local_68._0_4_ = auVar42._0_4_ << iVar33;
    local_68._4_4_ = auVar42._4_4_;
    local_68._8_4_ = auVar42._8_4_;
    local_68._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_68,auVar49);
    auVar69._0_8_ = auVar49._8_8_;
    auVar69._8_4_ = auVar49._8_4_;
    auVar69._12_4_ = auVar49._12_4_;
    auVar43 = pmovsxwd(auVar69,auVar69);
    uStack_54 = auVar42._4_4_;
    local_58 = auVar42._0_4_ << iVar33;
    iStack_50 = auVar42._8_4_;
    iStack_4c = auVar42._12_4_;
    iStack_44 = auVar43._4_4_;
    local_48 = auVar43._0_4_ << iVar33;
    iStack_40 = auVar43._8_4_;
    iStack_3c = auVar43._12_4_;
    goto LAB_00b37530;
  case 3:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar42 = *(undefined1 (*) [16])input;
    auVar43 = *(undefined1 (*) [16])(input + stride);
    auVar44 = *(undefined1 (*) [16])(input + stride * 2);
    auVar45 = *(undefined1 (*) [16])(input + stride * 3);
    auVar46 = *(undefined1 (*) [16])(input + stride * 4);
    auVar47 = *(undefined1 (*) [16])(input + stride * 5);
    auVar48 = *(undefined1 (*) [16])(input + stride * 6);
    auVar70 = pmovsxwd(in_XMM9,auVar42);
    auVar49 = *(undefined1 (*) [16])(input + stride * 7);
    uStack_130 = auVar42._8_8_;
    lVar27 = uStack_130;
    local_138._4_4_ = auVar70._4_4_;
    local_138._0_4_ = auVar70._0_4_ << local_48;
    uStack_130._4_4_ = auVar42._12_4_;
    uVar28 = uStack_130._4_4_;
    uStack_130._0_4_ = auVar70._8_4_;
    uStack_130._4_4_ = auVar70._12_4_;
    auVar125._8_4_ = auVar42._8_4_;
    auVar125._0_8_ = lVar27;
    auVar125._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar125,auVar125);
    local_128._0_4_ = auVar42._0_4_ << local_48;
    local_128._4_4_ = auVar42._4_4_;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd((undefined1  [16])_local_128,auVar43);
    local_118._8_8_ = auVar44._8_8_;
    uVar5 = local_118._8_8_;
    local_118._4_4_ = auVar42._4_4_;
    local_118._0_4_ = auVar42._0_4_ << local_48;
    local_118._12_4_ = auVar44._12_4_;
    uVar28 = local_118._12_4_;
    local_118._8_4_ = auVar42._8_4_;
    local_118._12_4_ = auVar42._12_4_;
    auVar116._8_4_ = auVar43._8_4_;
    auVar116._12_4_ = auVar43._12_4_;
    auVar116._0_8_ = auVar43._8_8_;
    auVar42 = pmovsxwd(auVar116,auVar116);
    local_108._0_4_ = auVar42._0_4_ << local_48;
    local_108._4_4_ = auVar42._4_4_;
    local_108._8_4_ = auVar42._8_4_;
    local_108._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_108,auVar44);
    local_f8._8_8_ = auVar46._8_8_;
    uVar6 = local_f8._8_8_;
    local_f8._4_4_ = auVar42._4_4_;
    local_f8._0_4_ = auVar42._0_4_ << local_48;
    local_f8._12_4_ = auVar46._12_4_;
    uVar29 = local_f8._12_4_;
    local_f8._8_4_ = auVar42._8_4_;
    local_f8._12_4_ = auVar42._12_4_;
    auVar104._8_4_ = auVar44._8_4_;
    auVar104._0_8_ = uVar5;
    auVar104._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar104,auVar104);
    local_e8._0_4_ = auVar42._0_4_ << local_48;
    local_e8._4_4_ = auVar42._4_4_;
    local_e8._8_4_ = auVar42._8_4_;
    local_e8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_e8,auVar45);
    local_d8._0_4_ = auVar42._0_4_ << local_48;
    local_d8._4_4_ = auVar42._4_4_;
    local_d8._8_4_ = auVar42._8_4_;
    local_d8._12_4_ = auVar42._12_4_;
    auVar43 = pmovsxwd(local_d8,auVar46);
    auVar95._8_4_ = auVar45._8_4_;
    auVar95._12_4_ = auVar45._12_4_;
    auVar95._0_8_ = auVar45._8_8_;
    auVar42 = pmovsxwd(auVar95,auVar95);
    local_c8._4_4_ = auVar42._4_4_;
    local_c8._0_4_ = auVar42._0_4_ << local_48;
    local_c8._8_4_ = auVar42._8_4_;
    local_c8._12_4_ = auVar42._12_4_;
    iStack_b4 = auVar43._4_4_;
    local_b8 = auVar43._0_4_ << local_48;
    uStack_b0._0_4_ = auVar43._8_4_;
    uStack_b0._4_4_ = auVar43._12_4_;
    auVar84._8_4_ = auVar46._8_4_;
    auVar84._0_8_ = uVar6;
    auVar84._12_4_ = uVar29;
    auVar42 = pmovsxwd(auVar84,auVar84);
    local_a8._0_4_ = auVar42._0_4_ << local_48;
    local_a8._4_4_ = auVar42._4_4_;
    local_a8._8_4_ = auVar42._8_4_;
    local_a8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_a8,auVar47);
    local_98._4_4_ = auVar42._4_4_;
    local_98._0_4_ = auVar42._0_4_ << local_48;
    local_98._8_4_ = auVar42._8_4_;
    local_98._12_4_ = auVar42._12_4_;
    auVar71._8_4_ = auVar47._8_4_;
    auVar71._12_4_ = auVar47._12_4_;
    auVar71._0_8_ = auVar47._8_8_;
    auVar42 = pmovsxwd(auVar71,auVar71);
    local_88._0_4_ = auVar42._0_4_ << local_48;
    local_88._4_4_ = auVar42._4_4_;
    local_88._8_4_ = auVar42._8_4_;
    local_88._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_88,auVar48);
    local_78._4_4_ = auVar42._4_4_;
    local_78._0_4_ = auVar42._0_4_ << local_48;
    uStack_70._0_4_ = auVar42._8_4_;
    uStack_70._4_4_ = auVar42._12_4_;
    auVar50._8_4_ = auVar48._8_4_;
    auVar50._12_4_ = auVar48._12_4_;
    auVar50._0_8_ = auVar48._8_8_;
    auVar42 = pmovsxwd(auVar50,auVar50);
    local_68._0_4_ = auVar42._0_4_ << local_48;
    local_68._4_4_ = auVar42._4_4_;
    local_68._8_4_ = auVar42._8_4_;
    local_68._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_68,auVar49);
    auVar72._0_8_ = auVar49._8_8_;
    auVar72._8_4_ = auVar49._8_4_;
    auVar72._12_4_ = auVar49._12_4_;
    auVar43 = pmovsxwd(auVar72,auVar72);
    local_58 = auVar42._0_4_ << local_48;
    uStack_54 = auVar42._4_4_;
    iStack_50 = auVar42._8_4_;
    iStack_4c = auVar42._12_4_;
    local_48 = auVar43._0_4_ << local_48;
    iStack_44 = auVar43._4_4_;
    iStack_40 = auVar43._8_4_;
    iStack_3c = auVar43._12_4_;
    goto LAB_00b389a6;
  case 4:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar42 = *(undefined1 (*) [16])(input + stride * 7);
    auVar43 = *(undefined1 (*) [16])(input + stride * 6);
    auVar44 = *(undefined1 (*) [16])(input + stride * 5);
    auVar45 = *(undefined1 (*) [16])(input + stride * 4);
    auVar46 = *(undefined1 (*) [16])(input + stride * 3);
    auVar47 = *(undefined1 (*) [16])(input + stride * 2);
    auVar48 = *(undefined1 (*) [16])(input + stride);
    auVar70 = pmovsxwd(in_XMM9,auVar42);
    auVar49 = *(undefined1 (*) [16])input;
    uStack_130 = auVar42._8_8_;
    lVar27 = uStack_130;
    local_138._4_4_ = auVar70._4_4_;
    local_138._0_4_ = auVar70._0_4_ << local_48;
    uStack_130._4_4_ = auVar42._12_4_;
    uVar28 = uStack_130._4_4_;
    uStack_130._0_4_ = auVar70._8_4_;
    uStack_130._4_4_ = auVar70._12_4_;
    auVar129._8_4_ = auVar42._8_4_;
    auVar129._0_8_ = lVar27;
    auVar129._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar129,auVar129);
    local_128._0_4_ = auVar42._0_4_ << local_48;
    local_128._4_4_ = auVar42._4_4_;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd((undefined1  [16])_local_128,auVar43);
    local_118._8_8_ = auVar44._8_8_;
    uVar5 = local_118._8_8_;
    local_118._4_4_ = auVar42._4_4_;
    local_118._0_4_ = auVar42._0_4_ << local_48;
    local_118._12_4_ = auVar44._12_4_;
    uVar28 = local_118._12_4_;
    local_118._8_4_ = auVar42._8_4_;
    local_118._12_4_ = auVar42._12_4_;
    auVar121._8_4_ = auVar43._8_4_;
    auVar121._12_4_ = auVar43._12_4_;
    auVar121._0_8_ = auVar43._8_8_;
    auVar42 = pmovsxwd(auVar121,auVar121);
    local_108._0_4_ = auVar42._0_4_ << local_48;
    local_108._4_4_ = auVar42._4_4_;
    local_108._8_4_ = auVar42._8_4_;
    local_108._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_108,auVar44);
    local_f8._8_8_ = auVar46._8_8_;
    uVar6 = local_f8._8_8_;
    local_f8._4_4_ = auVar42._4_4_;
    local_f8._0_4_ = auVar42._0_4_ << local_48;
    local_f8._12_4_ = auVar46._12_4_;
    uVar29 = local_f8._12_4_;
    local_f8._8_4_ = auVar42._8_4_;
    local_f8._12_4_ = auVar42._12_4_;
    auVar108._8_4_ = auVar44._8_4_;
    auVar108._0_8_ = uVar5;
    auVar108._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar108,auVar108);
    local_e8._0_4_ = auVar42._0_4_ << local_48;
    local_e8._4_4_ = auVar42._4_4_;
    local_e8._8_4_ = auVar42._8_4_;
    local_e8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_e8,auVar45);
    local_d8._0_4_ = auVar42._0_4_ << local_48;
    local_d8._4_4_ = auVar42._4_4_;
    local_d8._8_4_ = auVar42._8_4_;
    local_d8._12_4_ = auVar42._12_4_;
    auVar43 = pmovsxwd(local_d8,auVar46);
    auVar100._8_4_ = auVar45._8_4_;
    auVar100._12_4_ = auVar45._12_4_;
    auVar100._0_8_ = auVar45._8_8_;
    auVar42 = pmovsxwd(auVar100,auVar100);
    local_c8._4_4_ = auVar42._4_4_;
    local_c8._0_4_ = auVar42._0_4_ << local_48;
    local_c8._8_4_ = auVar42._8_4_;
    local_c8._12_4_ = auVar42._12_4_;
    iStack_b4 = auVar43._4_4_;
    local_b8 = auVar43._0_4_ << local_48;
    uStack_b0._0_4_ = auVar43._8_4_;
    uStack_b0._4_4_ = auVar43._12_4_;
    auVar81._8_4_ = auVar46._8_4_;
    auVar81._0_8_ = uVar6;
    auVar81._12_4_ = uVar29;
    auVar42 = pmovsxwd(auVar81,auVar81);
    local_a8._0_4_ = auVar42._0_4_ << local_48;
    local_a8._4_4_ = auVar42._4_4_;
    local_a8._8_4_ = auVar42._8_4_;
    local_a8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_a8,auVar47);
    local_98._4_4_ = auVar42._4_4_;
    local_98._0_4_ = auVar42._0_4_ << local_48;
    local_98._8_4_ = auVar42._8_4_;
    local_98._12_4_ = auVar42._12_4_;
    auVar64._8_4_ = auVar47._8_4_;
    auVar64._12_4_ = auVar47._12_4_;
    auVar64._0_8_ = auVar47._8_8_;
    auVar42 = pmovsxwd(auVar64,auVar64);
    local_88._0_4_ = auVar42._0_4_ << local_48;
    local_88._4_4_ = auVar42._4_4_;
    local_88._8_4_ = auVar42._8_4_;
    local_88._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_88,auVar48);
    local_78._4_4_ = auVar42._4_4_;
    local_78._0_4_ = auVar42._0_4_ << local_48;
    uStack_70._0_4_ = auVar42._8_4_;
    uStack_70._4_4_ = auVar42._12_4_;
    auVar37._8_4_ = auVar48._8_4_;
    auVar37._12_4_ = auVar48._12_4_;
    auVar37._0_8_ = auVar48._8_8_;
    auVar42 = pmovsxwd(auVar37,auVar37);
    local_68._0_4_ = auVar42._0_4_ << local_48;
    local_68._4_4_ = auVar42._4_4_;
    local_68._8_4_ = auVar42._8_4_;
    local_68._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_68,auVar49);
    auVar65._0_8_ = auVar49._8_8_;
    auVar65._8_4_ = auVar49._8_4_;
    auVar65._12_4_ = auVar49._12_4_;
    auVar43 = pmovsxwd(auVar65,auVar65);
    local_58 = auVar42._0_4_ << local_48;
    uStack_54 = auVar42._4_4_;
    iStack_50 = auVar42._8_4_;
    iStack_4c = auVar42._12_4_;
    local_48 = auVar43._0_4_ << local_48;
    iStack_44 = auVar43._4_4_;
    iStack_40 = auVar43._8_4_;
    iStack_3c = auVar43._12_4_;
LAB_00b36e32:
    fadst8x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,0xd,2);
    iVar33 = 1 << (~piVar26[1] & 0x1fU);
    auVar42 = ZEXT416((uint)-(int)piVar26[1]);
    local_238 = local_238 + iVar33 >> auVar42;
    iStack_234 = iStack_234 + iVar33 >> auVar42;
    iStack_230 = iStack_230 + iVar33 >> auVar42;
    iStack_22c = iStack_22c + iVar33 >> auVar42;
    local_228 = local_228 + iVar33 >> auVar42;
    iStack_224 = iStack_224 + iVar33 >> auVar42;
    iStack_220 = iStack_220 + iVar33 >> auVar42;
    iStack_21c = iStack_21c + iVar33 >> auVar42;
    local_218 = local_218 + iVar33 >> auVar42;
    iStack_214 = iStack_214 + iVar33 >> auVar42;
    iStack_210 = iStack_210 + iVar33 >> auVar42;
    iStack_20c = iStack_20c + iVar33 >> auVar42;
    local_208 = local_208 + iVar33 >> auVar42;
    iStack_204 = iStack_204 + iVar33 >> auVar42;
    iStack_200 = iStack_200 + iVar33 >> auVar42;
    iStack_1fc = iStack_1fc + iVar33 >> auVar42;
    local_1f8 = local_1f8 + iVar33 >> auVar42;
    iStack_1f4 = iStack_1f4 + iVar33 >> auVar42;
    iStack_1f0 = iStack_1f0 + iVar33 >> auVar42;
    iStack_1ec = iStack_1ec + iVar33 >> auVar42;
    local_1e8 = local_1e8 + iVar33 >> auVar42;
    iStack_1e4 = iStack_1e4 + iVar33 >> auVar42;
    iStack_1e0 = iStack_1e0 + iVar33 >> auVar42;
    iStack_1dc = iStack_1dc + iVar33 >> auVar42;
    local_1d8 = local_1d8 + iVar33 >> auVar42;
    iStack_1d4 = iStack_1d4 + iVar33 >> auVar42;
    iStack_1d0 = iStack_1d0 + iVar33 >> auVar42;
    iStack_1cc = iStack_1cc + iVar33 >> auVar42;
    local_1c8 = local_1c8 + iVar33 >> auVar42;
    iStack_1c4 = iStack_1c4 + iVar33 >> auVar42;
    iStack_1c0 = iStack_1c0 + iVar33 >> auVar42;
    iStack_1bc = iStack_1bc + iVar33 >> auVar42;
    local_1b8 = local_1b8 + iVar33 >> auVar42;
    iStack_1b4 = iStack_1b4 + iVar33 >> auVar42;
    iStack_1b0 = iStack_1b0 + iVar33 >> auVar42;
    iStack_1ac = iStack_1ac + iVar33 >> auVar42;
    local_1a8 = local_1a8 + iVar33 >> auVar42;
    iStack_1a4 = iStack_1a4 + iVar33 >> auVar42;
    iStack_1a0 = iStack_1a0 + iVar33 >> auVar42;
    iStack_19c = iStack_19c + iVar33 >> auVar42;
    local_198 = local_198 + iVar33 >> auVar42;
    iStack_194 = iStack_194 + iVar33 >> auVar42;
    iStack_190 = iStack_190 + iVar33 >> auVar42;
    iStack_18c = iStack_18c + iVar33 >> auVar42;
    local_188 = local_188 + iVar33 >> auVar42;
    iStack_184 = iStack_184 + iVar33 >> auVar42;
    iStack_180 = iStack_180 + iVar33 >> auVar42;
    iStack_17c = iStack_17c + iVar33 >> auVar42;
    local_178 = local_178 + iVar33 >> auVar42;
    iStack_174 = iStack_174 + iVar33 >> auVar42;
    iStack_170 = iStack_170 + iVar33 >> auVar42;
    iStack_16c = iStack_16c + iVar33 >> auVar42;
    local_168 = local_168 + iVar33 >> auVar42;
    iStack_164 = iStack_164 + iVar33 >> auVar42;
    iStack_160 = iStack_160 + iVar33 >> auVar42;
    iStack_38 = iStack_15c + iVar33 >> auVar42;
    local_158 = local_158 + iVar33 >> auVar42;
    iStack_154 = iStack_154 + iVar33 >> auVar42;
    iStack_150 = iStack_150 + iVar33 >> auVar42;
    iStack_14c = iStack_14c + iVar33 >> auVar42;
    local_148 = iVar33 + local_148 >> auVar42;
    iStack_144 = iVar33 + iStack_144 >> auVar42;
    iStack_140 = iVar33 + iStack_140 >> auVar42;
    iStack_34 = iVar33 + iStack_13c >> auVar42;
    local_138._4_4_ = local_218;
    local_138._0_4_ = local_238;
    uStack_130._4_4_ = local_1d8;
    uStack_130._0_4_ = local_1f8;
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    auVar16._4_8_ = local_f8._8_8_;
    auVar16._0_4_ = iStack_210;
    local_f8._0_8_ = auVar16._0_8_ << 0x20;
    local_f8._8_4_ = iStack_1f0;
    local_f8._12_4_ = iStack_1d0;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0._4_4_ = local_1c8;
    uStack_b0._0_4_ = local_1e8;
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    auVar17._4_8_ = uStack_70;
    auVar17._0_4_ = iStack_200;
    local_78 = auVar17._0_8_ << 0x20;
    uStack_70._0_4_ = iStack_1e0;
    uStack_70._4_4_ = iStack_1c0;
    iStack_50 = iStack_21c;
    iStack_4c = iStack_1fc;
    iStack_44 = iStack_1bc;
    local_48 = iStack_1dc;
    local_128._4_4_ = local_198;
    local_128._0_4_ = local_1b8;
    uStack_120._4_4_ = local_158;
    uStack_120._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_f8._4_4_ = iStack_154;
    local_f8._0_4_ = iStack_174;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    iStack_b4 = iStack_14c;
    local_b8 = iStack_16c;
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_78._4_4_ = iStack_144;
    local_78._0_4_ = iStack_164;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    iStack_40 = iStack_19c;
    iStack_3c = iStack_17c;
    break;
  case 5:
    iVar33 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar42 = pshufb(*(undefined1 (*) [16])input,_DAT_00dcc090);
    auVar43 = pshufb(*(undefined1 (*) [16])(input + stride),_DAT_00dcc090);
    auVar44 = pshufb(*(undefined1 (*) [16])(input + stride * 2),_DAT_00dcc090);
    auVar45 = pshufb(*(undefined1 (*) [16])(input + stride * 3),_DAT_00dcc090);
    auVar46 = pshufb(*(undefined1 (*) [16])(input + stride * 4),_DAT_00dcc090);
    auVar47 = pshufb(*(undefined1 (*) [16])(input + stride * 5),_DAT_00dcc090);
    auVar48 = pshufb(*(undefined1 (*) [16])(input + stride * 6),_DAT_00dcc090);
    auVar49 = pshufb(*(undefined1 (*) [16])(input + stride * 7),_DAT_00dcc090);
    auVar110 = pmovsxwd(in_XMM6,auVar46);
    auVar52._8_4_ = auVar46._8_4_;
    auVar52._12_4_ = auVar46._12_4_;
    auVar52._0_8_ = auVar46._8_8_;
    auVar115 = pmovsxwd(in_XMM7,auVar52);
    auVar70 = pmovsxwd(_DAT_00dcc090,auVar47);
    auVar53._8_4_ = auVar47._8_4_;
    auVar53._12_4_ = auVar47._12_4_;
    auVar53._0_8_ = auVar47._8_8_;
    auVar94 = pmovsxwd(in_XMM3,auVar53);
    auVar103 = pmovsxwd(in_XMM4,auVar48);
    auVar54._8_4_ = auVar48._8_4_;
    auVar54._12_4_ = auVar48._12_4_;
    auVar54._0_8_ = auVar48._8_8_;
    auVar48 = pmovsxwd(in_XMM5,auVar54);
    auVar46 = pmovsxwd(auVar54,auVar49);
    auVar86._8_4_ = auVar49._8_4_;
    auVar86._12_4_ = auVar49._12_4_;
    auVar86._0_8_ = auVar49._8_8_;
    auVar47 = pmovsxwd(auVar86,auVar86);
    auVar49 = pmovsxwd(in_XMM9,auVar45);
    auVar135._8_4_ = auVar45._8_4_;
    auVar135._12_4_ = auVar45._12_4_;
    auVar135._0_8_ = auVar45._8_8_;
    auVar45 = pmovsxwd(in_XMM10,auVar135);
    auVar124 = pmovsxwd(in_XMM11,auVar44);
    auVar136._8_4_ = auVar44._8_4_;
    auVar136._12_4_ = auVar44._12_4_;
    auVar136._0_8_ = auVar44._8_8_;
    auVar44 = pmovsxwd(in_XMM12,auVar136);
    auVar145 = pmovsxwd(in_XMM13,auVar43);
    auVar137._8_4_ = auVar43._8_4_;
    auVar137._12_4_ = auVar43._12_4_;
    auVar137._0_8_ = auVar43._8_8_;
    auVar43 = pmovsxwd(in_XMM14,auVar137);
    auVar146 = pmovsxwd(in_XMM15,auVar42);
    auVar138._8_4_ = auVar42._8_4_;
    auVar138._12_4_ = auVar42._12_4_;
    auVar138._0_8_ = auVar42._8_8_;
    auVar42 = pmovsxwd(auVar46,auVar138);
    local_138._4_4_ = auVar146._4_4_;
    local_138._0_4_ = auVar146._0_4_ << iVar33;
    uStack_130._0_4_ = auVar146._8_4_;
    uStack_130._4_4_ = auVar146._12_4_;
    local_128._4_4_ = auVar42._4_4_;
    local_128._0_4_ = auVar42._0_4_ << iVar33;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    local_118._4_4_ = auVar145._4_4_;
    local_118._0_4_ = auVar145._0_4_ << iVar33;
    local_118._8_4_ = auVar145._8_4_;
    local_118._12_4_ = auVar145._12_4_;
    local_108._4_4_ = auVar43._4_4_;
    local_108._0_4_ = auVar43._0_4_ << iVar33;
    local_108._8_4_ = auVar43._8_4_;
    local_108._12_4_ = auVar43._12_4_;
    local_f8._4_4_ = auVar124._4_4_;
    local_f8._0_4_ = auVar124._0_4_ << iVar33;
    local_f8._8_4_ = auVar124._8_4_;
    local_f8._12_4_ = auVar124._12_4_;
    local_e8._4_4_ = auVar44._4_4_;
    local_e8._0_4_ = auVar44._0_4_ << iVar33;
    local_e8._8_4_ = auVar44._8_4_;
    local_e8._12_4_ = auVar44._12_4_;
    local_d8._4_4_ = auVar49._4_4_;
    local_d8._0_4_ = auVar49._0_4_ << iVar33;
    local_d8._8_4_ = auVar49._8_4_;
    local_d8._12_4_ = auVar49._12_4_;
    local_c8._4_4_ = auVar45._4_4_;
    local_c8._0_4_ = auVar45._0_4_ << iVar33;
    local_c8._8_4_ = auVar45._8_4_;
    local_c8._12_4_ = auVar45._12_4_;
    iStack_b4 = auVar110._4_4_;
    local_b8 = auVar110._0_4_ << iVar33;
    uStack_b0._0_4_ = auVar110._8_4_;
    uStack_b0._4_4_ = auVar110._12_4_;
    local_a8._4_4_ = auVar115._4_4_;
    local_a8._0_4_ = auVar115._0_4_ << iVar33;
    local_a8._8_4_ = auVar115._8_4_;
    local_a8._12_4_ = auVar115._12_4_;
    local_98._4_4_ = auVar70._4_4_;
    local_98._0_4_ = auVar70._0_4_ << iVar33;
    local_98._8_4_ = auVar70._8_4_;
    local_98._12_4_ = auVar70._12_4_;
    local_88._4_4_ = auVar94._4_4_;
    local_88._0_4_ = auVar94._0_4_ << iVar33;
    local_88._8_4_ = auVar94._8_4_;
    local_88._12_4_ = auVar94._12_4_;
    local_78._4_4_ = auVar103._4_4_;
    local_78._0_4_ = auVar103._0_4_ << iVar33;
    uStack_70._0_4_ = auVar103._8_4_;
    uStack_70._4_4_ = auVar103._12_4_;
    local_68._4_4_ = auVar48._4_4_;
    local_68._0_4_ = auVar48._0_4_ << iVar33;
    local_68._8_4_ = auVar48._8_4_;
    local_68._12_4_ = auVar48._12_4_;
    local_258 = auVar46._0_4_;
    uStack_254 = auVar46._4_4_;
    uStack_250 = auVar46._8_4_;
    uStack_24c = auVar46._12_4_;
    uStack_54 = uStack_254;
    local_58 = local_258 << iVar33;
    iStack_50 = uStack_250;
    iStack_4c = uStack_24c;
    iStack_44 = auVar47._4_4_;
    local_48 = auVar47._0_4_ << iVar33;
    iStack_40 = auVar47._8_4_;
    iStack_3c = auVar47._12_4_;
LAB_00b37530:
    fdct4x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,0xd,2);
    fdct4x8_sse4_1((__m128i *)local_128,(__m128i *)&local_228,0xd,2);
    iVar33 = 1 << (~piVar26[1] & 0x1fU);
    auVar42 = ZEXT416((uint)-(int)piVar26[1]);
    local_238 = local_238 + iVar33 >> auVar42;
    iStack_234 = iStack_234 + iVar33 >> auVar42;
    iStack_230 = iStack_230 + iVar33 >> auVar42;
    iStack_22c = iStack_22c + iVar33 >> auVar42;
    local_228 = local_228 + iVar33 >> auVar42;
    iStack_224 = iStack_224 + iVar33 >> auVar42;
    iStack_220 = iStack_220 + iVar33 >> auVar42;
    iStack_21c = iStack_21c + iVar33 >> auVar42;
    local_218 = local_218 + iVar33 >> auVar42;
    iStack_214 = iStack_214 + iVar33 >> auVar42;
    iStack_210 = iStack_210 + iVar33 >> auVar42;
    iStack_20c = iStack_20c + iVar33 >> auVar42;
    local_208 = local_208 + iVar33 >> auVar42;
    iStack_204 = iStack_204 + iVar33 >> auVar42;
    iStack_200 = iStack_200 + iVar33 >> auVar42;
    iStack_1fc = iStack_1fc + iVar33 >> auVar42;
    local_1f8 = local_1f8 + iVar33 >> auVar42;
    iStack_1f4 = iStack_1f4 + iVar33 >> auVar42;
    iStack_1f0 = iStack_1f0 + iVar33 >> auVar42;
    iStack_1ec = iStack_1ec + iVar33 >> auVar42;
    local_1e8 = local_1e8 + iVar33 >> auVar42;
    iStack_1e4 = iStack_1e4 + iVar33 >> auVar42;
    iStack_1e0 = iStack_1e0 + iVar33 >> auVar42;
    iStack_1dc = iStack_1dc + iVar33 >> auVar42;
    local_1d8 = local_1d8 + iVar33 >> auVar42;
    iStack_1d4 = iStack_1d4 + iVar33 >> auVar42;
    iStack_1d0 = iStack_1d0 + iVar33 >> auVar42;
    iStack_1cc = iStack_1cc + iVar33 >> auVar42;
    local_1c8 = local_1c8 + iVar33 >> auVar42;
    iStack_1c4 = iStack_1c4 + iVar33 >> auVar42;
    iStack_1c0 = iStack_1c0 + iVar33 >> auVar42;
    iStack_1bc = iStack_1bc + iVar33 >> auVar42;
    local_1b8 = local_1b8 + iVar33 >> auVar42;
    iStack_1b4 = iStack_1b4 + iVar33 >> auVar42;
    iStack_1b0 = iStack_1b0 + iVar33 >> auVar42;
    iStack_1ac = iStack_1ac + iVar33 >> auVar42;
    local_1a8 = local_1a8 + iVar33 >> auVar42;
    iStack_1a4 = iStack_1a4 + iVar33 >> auVar42;
    iStack_1a0 = iStack_1a0 + iVar33 >> auVar42;
    iStack_19c = iStack_19c + iVar33 >> auVar42;
    local_198 = local_198 + iVar33 >> auVar42;
    iStack_194 = iStack_194 + iVar33 >> auVar42;
    iStack_190 = iStack_190 + iVar33 >> auVar42;
    iStack_18c = iStack_18c + iVar33 >> auVar42;
    local_188 = local_188 + iVar33 >> auVar42;
    iStack_184 = iStack_184 + iVar33 >> auVar42;
    iStack_180 = iStack_180 + iVar33 >> auVar42;
    iStack_17c = iStack_17c + iVar33 >> auVar42;
    local_178 = local_178 + iVar33 >> auVar42;
    iStack_174 = iStack_174 + iVar33 >> auVar42;
    iStack_170 = iStack_170 + iVar33 >> auVar42;
    iStack_16c = iStack_16c + iVar33 >> auVar42;
    local_168 = local_168 + iVar33 >> auVar42;
    iStack_164 = iStack_164 + iVar33 >> auVar42;
    iStack_160 = iStack_160 + iVar33 >> auVar42;
    iStack_38 = iStack_15c + iVar33 >> auVar42;
    local_158 = local_158 + iVar33 >> auVar42;
    iStack_154 = iStack_154 + iVar33 >> auVar42;
    iStack_150 = iStack_150 + iVar33 >> auVar42;
    iStack_14c = iStack_14c + iVar33 >> auVar42;
    local_148 = iVar33 + local_148 >> auVar42;
    iStack_144 = iVar33 + iStack_144 >> auVar42;
    iStack_140 = iVar33 + iStack_140 >> auVar42;
    iStack_34 = iVar33 + iStack_13c >> auVar42;
    local_138._4_4_ = local_218;
    local_138._0_4_ = local_238;
    uStack_130._4_4_ = local_1d8;
    uStack_130._0_4_ = local_1f8;
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    auVar18._4_8_ = local_f8._8_8_;
    auVar18._0_4_ = iStack_210;
    local_f8._0_8_ = auVar18._0_8_ << 0x20;
    local_f8._8_4_ = iStack_1f0;
    local_f8._12_4_ = iStack_1d0;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0._4_4_ = local_1c8;
    uStack_b0._0_4_ = local_1e8;
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    auVar19._4_8_ = uStack_70;
    auVar19._0_4_ = iStack_200;
    local_78 = auVar19._0_8_ << 0x20;
    uStack_70._0_4_ = iStack_1e0;
    uStack_70._4_4_ = iStack_1c0;
    iStack_50 = iStack_21c;
    iStack_4c = iStack_1fc;
    iStack_44 = iStack_1bc;
    local_48 = iStack_1dc;
    local_128._4_4_ = local_198;
    local_128._0_4_ = local_1b8;
    uStack_120._4_4_ = local_158;
    uStack_120._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_f8._4_4_ = iStack_154;
    local_f8._0_4_ = iStack_174;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    iStack_b4 = iStack_14c;
    local_b8 = iStack_16c;
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_78._4_4_ = iStack_144;
    local_78._0_4_ = iStack_164;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    iStack_40 = iStack_19c;
    iStack_3c = iStack_17c;
LAB_00b38d71:
    iStack_15c = iStack_38;
    iStack_13c = iStack_34;
    fadst8x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,0xd,2);
    goto LAB_00b38d7b;
  case 6:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    _local_138 = *(__m128i *)(input + stride * 7);
    _local_128 = *(__m128i *)(input + stride * 6);
    local_118 = *(undefined1 (*) [16])(input + stride * 5);
    local_108 = *(undefined1 (*) [16])(input + stride * 4);
    local_f8 = *(undefined1 (*) [16])(input + stride * 3);
    local_e8 = *(undefined1 (*) [16])(input + stride * 2);
    local_d8 = *(undefined1 (*) [16])(input + stride);
    local_c8._0_8_ = *(undefined8 *)input;
    local_c8._8_8_ = *(undefined8 *)(input + 4);
    goto LAB_00b37fc0;
  case 7:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    _local_138 = *(__m128i *)input;
    _local_128 = *(__m128i *)(input + stride);
    local_118 = *(undefined1 (*) [16])(input + stride * 2);
    local_108 = *(undefined1 (*) [16])(input + stride * 3);
    local_f8 = *(undefined1 (*) [16])(input + stride * 4);
    local_e8 = *(undefined1 (*) [16])(input + stride * 5);
    local_d8 = *(undefined1 (*) [16])(input + stride * 6);
    local_c8._0_8_ = *(undefined8 *)(input + stride * 7);
    local_c8._8_8_ = *(undefined8 *)(input + stride * 7 + 4);
LAB_00b37fc0:
    iVar33 = (int)cVar1;
    auVar42 = pshufb((undefined1  [16])_local_138,_DAT_00dcc090);
    auVar43 = pshufb((undefined1  [16])_local_128,_DAT_00dcc090);
    auVar44 = pshufb(local_118,_DAT_00dcc090);
    auVar45 = pshufb(local_108,_DAT_00dcc090);
    auVar46 = pshufb(local_f8,_DAT_00dcc090);
    auVar47 = pshufb(local_e8,_DAT_00dcc090);
    auVar48 = pshufb(local_d8,_DAT_00dcc090);
    auVar49 = pshufb(local_c8,_DAT_00dcc090);
    auVar110 = pmovsxwd(in_XMM6,auVar46);
    auVar55._8_4_ = auVar46._8_4_;
    auVar55._12_4_ = auVar46._12_4_;
    auVar55._0_8_ = auVar46._8_8_;
    auVar115 = pmovsxwd(in_XMM7,auVar55);
    auVar70 = pmovsxwd(_DAT_00dcc090,auVar47);
    auVar56._8_4_ = auVar47._8_4_;
    auVar56._12_4_ = auVar47._12_4_;
    auVar56._0_8_ = auVar47._8_8_;
    auVar94 = pmovsxwd(in_XMM3,auVar56);
    auVar103 = pmovsxwd(in_XMM4,auVar48);
    auVar57._8_4_ = auVar48._8_4_;
    auVar57._12_4_ = auVar48._12_4_;
    auVar57._0_8_ = auVar48._8_8_;
    auVar48 = pmovsxwd(in_XMM5,auVar57);
    auVar46 = pmovsxwd(auVar57,auVar49);
    auVar87._8_4_ = auVar49._8_4_;
    auVar87._12_4_ = auVar49._12_4_;
    auVar87._0_8_ = auVar49._8_8_;
    auVar47 = pmovsxwd(auVar87,auVar87);
    auVar49 = pmovsxwd(in_XMM9,auVar45);
    auVar140._8_4_ = auVar45._8_4_;
    auVar140._12_4_ = auVar45._12_4_;
    auVar140._0_8_ = auVar45._8_8_;
    auVar45 = pmovsxwd(in_XMM10,auVar140);
    auVar124 = pmovsxwd(in_XMM11,auVar44);
    auVar141._8_4_ = auVar44._8_4_;
    auVar141._12_4_ = auVar44._12_4_;
    auVar141._0_8_ = auVar44._8_8_;
    auVar44 = pmovsxwd(in_XMM12,auVar141);
    auVar145 = pmovsxwd(in_XMM13,auVar43);
    auVar142._8_4_ = auVar43._8_4_;
    auVar142._12_4_ = auVar43._12_4_;
    auVar142._0_8_ = auVar43._8_8_;
    auVar43 = pmovsxwd(in_XMM14,auVar142);
    auVar146 = pmovsxwd(in_XMM15,auVar42);
    auVar143._8_4_ = auVar42._8_4_;
    auVar143._12_4_ = auVar42._12_4_;
    auVar143._0_8_ = auVar42._8_8_;
    auVar42 = pmovsxwd(auVar46,auVar143);
    local_138._4_4_ = auVar146._4_4_;
    local_138._0_4_ = auVar146._0_4_ << iVar33;
    uStack_130._0_4_ = auVar146._8_4_;
    uStack_130._4_4_ = auVar146._12_4_;
    local_128._4_4_ = auVar42._4_4_;
    local_128._0_4_ = auVar42._0_4_ << iVar33;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    local_118._4_4_ = auVar145._4_4_;
    local_118._0_4_ = auVar145._0_4_ << iVar33;
    local_118._8_4_ = auVar145._8_4_;
    local_118._12_4_ = auVar145._12_4_;
    local_108._4_4_ = auVar43._4_4_;
    local_108._0_4_ = auVar43._0_4_ << iVar33;
    local_108._8_4_ = auVar43._8_4_;
    local_108._12_4_ = auVar43._12_4_;
    local_f8._4_4_ = auVar124._4_4_;
    local_f8._0_4_ = auVar124._0_4_ << iVar33;
    local_f8._8_4_ = auVar124._8_4_;
    local_f8._12_4_ = auVar124._12_4_;
    local_e8._4_4_ = auVar44._4_4_;
    local_e8._0_4_ = auVar44._0_4_ << iVar33;
    local_e8._8_4_ = auVar44._8_4_;
    local_e8._12_4_ = auVar44._12_4_;
    local_d8._4_4_ = auVar49._4_4_;
    local_d8._0_4_ = auVar49._0_4_ << iVar33;
    local_d8._8_4_ = auVar49._8_4_;
    local_d8._12_4_ = auVar49._12_4_;
    local_c8._4_4_ = auVar45._4_4_;
    local_c8._0_4_ = auVar45._0_4_ << iVar33;
    local_c8._8_4_ = auVar45._8_4_;
    local_c8._12_4_ = auVar45._12_4_;
    iStack_b4 = auVar110._4_4_;
    local_b8 = auVar110._0_4_ << iVar33;
    uStack_b0._0_4_ = auVar110._8_4_;
    uStack_b0._4_4_ = auVar110._12_4_;
    local_a8._4_4_ = auVar115._4_4_;
    local_a8._0_4_ = auVar115._0_4_ << iVar33;
    local_a8._8_4_ = auVar115._8_4_;
    local_a8._12_4_ = auVar115._12_4_;
    local_98._4_4_ = auVar70._4_4_;
    local_98._0_4_ = auVar70._0_4_ << iVar33;
    local_98._8_4_ = auVar70._8_4_;
    local_98._12_4_ = auVar70._12_4_;
    local_88._4_4_ = auVar94._4_4_;
    local_88._0_4_ = auVar94._0_4_ << iVar33;
    local_88._8_4_ = auVar94._8_4_;
    local_88._12_4_ = auVar94._12_4_;
    local_78._4_4_ = auVar103._4_4_;
    local_78._0_4_ = auVar103._0_4_ << iVar33;
    uStack_70._0_4_ = auVar103._8_4_;
    uStack_70._4_4_ = auVar103._12_4_;
    local_68._4_4_ = auVar48._4_4_;
    local_68._0_4_ = auVar48._0_4_ << iVar33;
    local_68._8_4_ = auVar48._8_4_;
    local_68._12_4_ = auVar48._12_4_;
    local_258 = auVar46._0_4_;
    uStack_254 = auVar46._4_4_;
    uStack_250 = auVar46._8_4_;
    uStack_24c = auVar46._12_4_;
    uStack_54 = uStack_254;
    local_58 = local_258 << iVar33;
    iStack_50 = uStack_250;
    iStack_4c = uStack_24c;
    iStack_44 = auVar47._4_4_;
    local_48 = auVar47._0_4_ << iVar33;
    iStack_40 = auVar47._8_4_;
    iStack_3c = auVar47._12_4_;
    goto LAB_00b389b8;
  case 8:
    local_48 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar42 = *(undefined1 (*) [16])(input + stride * 7);
    auVar43 = *(undefined1 (*) [16])(input + stride * 6);
    auVar44 = *(undefined1 (*) [16])(input + stride * 5);
    auVar45 = *(undefined1 (*) [16])(input + stride * 4);
    auVar46 = *(undefined1 (*) [16])(input + stride * 3);
    auVar47 = *(undefined1 (*) [16])(input + stride * 2);
    auVar48 = *(undefined1 (*) [16])(input + stride);
    auVar70 = pmovsxwd(in_XMM9,auVar42);
    auVar49 = *(undefined1 (*) [16])input;
    uStack_130 = auVar42._8_8_;
    lVar27 = uStack_130;
    local_138._4_4_ = auVar70._4_4_;
    local_138._0_4_ = auVar70._0_4_ << local_48;
    uStack_130._4_4_ = auVar42._12_4_;
    uVar28 = uStack_130._4_4_;
    uStack_130._0_4_ = auVar70._8_4_;
    uStack_130._4_4_ = auVar70._12_4_;
    auVar144._8_4_ = auVar42._8_4_;
    auVar144._0_8_ = lVar27;
    auVar144._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar144,auVar144);
    local_128._0_4_ = auVar42._0_4_ << local_48;
    local_128._4_4_ = auVar42._4_4_;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd((undefined1  [16])_local_128,auVar43);
    local_118._8_8_ = auVar44._8_8_;
    uVar5 = local_118._8_8_;
    local_118._4_4_ = auVar42._4_4_;
    local_118._0_4_ = auVar42._0_4_ << local_48;
    local_118._12_4_ = auVar44._12_4_;
    uVar28 = local_118._12_4_;
    local_118._8_4_ = auVar42._8_4_;
    local_118._12_4_ = auVar42._12_4_;
    auVar128._8_4_ = auVar43._8_4_;
    auVar128._12_4_ = auVar43._12_4_;
    auVar128._0_8_ = auVar43._8_8_;
    auVar42 = pmovsxwd(auVar128,auVar128);
    local_108._0_4_ = auVar42._0_4_ << local_48;
    local_108._4_4_ = auVar42._4_4_;
    local_108._8_4_ = auVar42._8_4_;
    local_108._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_108,auVar44);
    local_f8._8_8_ = auVar46._8_8_;
    uVar6 = local_f8._8_8_;
    local_f8._4_4_ = auVar42._4_4_;
    local_f8._0_4_ = auVar42._0_4_ << local_48;
    local_f8._12_4_ = auVar46._12_4_;
    uVar29 = local_f8._12_4_;
    local_f8._8_4_ = auVar42._8_4_;
    local_f8._12_4_ = auVar42._12_4_;
    auVar111._8_4_ = auVar44._8_4_;
    auVar111._0_8_ = uVar5;
    auVar111._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar111,auVar111);
    local_e8._0_4_ = auVar42._0_4_ << local_48;
    local_e8._4_4_ = auVar42._4_4_;
    local_e8._8_4_ = auVar42._8_4_;
    local_e8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_e8,auVar45);
    local_d8._0_4_ = auVar42._0_4_ << local_48;
    local_d8._4_4_ = auVar42._4_4_;
    local_d8._8_4_ = auVar42._8_4_;
    local_d8._12_4_ = auVar42._12_4_;
    auVar43 = pmovsxwd(local_d8,auVar46);
    auVar107._8_4_ = auVar45._8_4_;
    auVar107._12_4_ = auVar45._12_4_;
    auVar107._0_8_ = auVar45._8_8_;
    auVar42 = pmovsxwd(auVar107,auVar107);
    local_c8._4_4_ = auVar42._4_4_;
    local_c8._0_4_ = auVar42._0_4_ << local_48;
    local_c8._8_4_ = auVar42._8_4_;
    local_c8._12_4_ = auVar42._12_4_;
    iStack_b4 = auVar43._4_4_;
    local_b8 = auVar43._0_4_ << local_48;
    uStack_b0._0_4_ = auVar43._8_4_;
    uStack_b0._4_4_ = auVar43._12_4_;
    auVar89._8_4_ = auVar46._8_4_;
    auVar89._0_8_ = uVar6;
    auVar89._12_4_ = uVar29;
    auVar42 = pmovsxwd(auVar89,auVar89);
    local_a8._0_4_ = auVar42._0_4_ << local_48;
    local_a8._4_4_ = auVar42._4_4_;
    local_a8._8_4_ = auVar42._8_4_;
    local_a8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_a8,auVar47);
    local_98._4_4_ = auVar42._4_4_;
    local_98._0_4_ = auVar42._0_4_ << local_48;
    local_98._8_4_ = auVar42._8_4_;
    local_98._12_4_ = auVar42._12_4_;
    auVar77._8_4_ = auVar47._8_4_;
    auVar77._12_4_ = auVar47._12_4_;
    auVar77._0_8_ = auVar47._8_8_;
    auVar42 = pmovsxwd(auVar77,auVar77);
    local_88._0_4_ = auVar42._0_4_ << local_48;
    local_88._4_4_ = auVar42._4_4_;
    local_88._8_4_ = auVar42._8_4_;
    local_88._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_88,auVar48);
    local_78._4_4_ = auVar42._4_4_;
    local_78._0_4_ = auVar42._0_4_ << local_48;
    uStack_70._0_4_ = auVar42._8_4_;
    uStack_70._4_4_ = auVar42._12_4_;
    auVar59._8_4_ = auVar48._8_4_;
    auVar59._12_4_ = auVar48._12_4_;
    auVar59._0_8_ = auVar48._8_8_;
    auVar42 = pmovsxwd(auVar59,auVar59);
    local_68._0_4_ = auVar42._0_4_ << local_48;
    local_68._4_4_ = auVar42._4_4_;
    local_68._8_4_ = auVar42._8_4_;
    local_68._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_68,auVar49);
    auVar78._0_8_ = auVar49._8_8_;
    auVar78._8_4_ = auVar49._8_4_;
    auVar78._12_4_ = auVar49._12_4_;
    auVar43 = pmovsxwd(auVar78,auVar78);
    local_58 = auVar42._0_4_ << local_48;
    uStack_54 = auVar42._4_4_;
    iStack_50 = auVar42._8_4_;
    iStack_4c = auVar42._12_4_;
    local_48 = auVar43._0_4_ << local_48;
    iStack_44 = auVar43._4_4_;
    iStack_40 = auVar43._8_4_;
    iStack_3c = auVar43._12_4_;
LAB_00b389a6:
LAB_00b389b8:
    fadst8x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,0xd,2);
    iVar33 = 1 << (~piVar26[1] & 0x1fU);
    auVar42 = ZEXT416((uint)-(int)piVar26[1]);
    local_238 = local_238 + iVar33 >> auVar42;
    iStack_234 = iStack_234 + iVar33 >> auVar42;
    iStack_230 = iStack_230 + iVar33 >> auVar42;
    iStack_22c = iStack_22c + iVar33 >> auVar42;
    local_228 = local_228 + iVar33 >> auVar42;
    iStack_224 = iStack_224 + iVar33 >> auVar42;
    iStack_220 = iStack_220 + iVar33 >> auVar42;
    iStack_21c = iStack_21c + iVar33 >> auVar42;
    local_218 = local_218 + iVar33 >> auVar42;
    iStack_214 = iStack_214 + iVar33 >> auVar42;
    iStack_210 = iStack_210 + iVar33 >> auVar42;
    iStack_20c = iStack_20c + iVar33 >> auVar42;
    local_208 = local_208 + iVar33 >> auVar42;
    iStack_204 = iStack_204 + iVar33 >> auVar42;
    iStack_200 = iStack_200 + iVar33 >> auVar42;
    iStack_1fc = iStack_1fc + iVar33 >> auVar42;
    local_1f8 = local_1f8 + iVar33 >> auVar42;
    iStack_1f4 = iStack_1f4 + iVar33 >> auVar42;
    iStack_1f0 = iStack_1f0 + iVar33 >> auVar42;
    iStack_1ec = iStack_1ec + iVar33 >> auVar42;
    local_1e8 = local_1e8 + iVar33 >> auVar42;
    iStack_1e4 = iStack_1e4 + iVar33 >> auVar42;
    iStack_1e0 = iStack_1e0 + iVar33 >> auVar42;
    iStack_1dc = iStack_1dc + iVar33 >> auVar42;
    local_1d8 = local_1d8 + iVar33 >> auVar42;
    iStack_1d4 = iStack_1d4 + iVar33 >> auVar42;
    iStack_1d0 = iStack_1d0 + iVar33 >> auVar42;
    iStack_1cc = iStack_1cc + iVar33 >> auVar42;
    local_1c8 = local_1c8 + iVar33 >> auVar42;
    iStack_1c4 = iStack_1c4 + iVar33 >> auVar42;
    iStack_1c0 = iStack_1c0 + iVar33 >> auVar42;
    iStack_1bc = iStack_1bc + iVar33 >> auVar42;
    local_1b8 = local_1b8 + iVar33 >> auVar42;
    iStack_1b4 = iStack_1b4 + iVar33 >> auVar42;
    iStack_1b0 = iStack_1b0 + iVar33 >> auVar42;
    iStack_1ac = iStack_1ac + iVar33 >> auVar42;
    local_1a8 = local_1a8 + iVar33 >> auVar42;
    iStack_1a4 = iStack_1a4 + iVar33 >> auVar42;
    iStack_1a0 = iStack_1a0 + iVar33 >> auVar42;
    iStack_19c = iStack_19c + iVar33 >> auVar42;
    local_198 = local_198 + iVar33 >> auVar42;
    iStack_194 = iStack_194 + iVar33 >> auVar42;
    iStack_190 = iStack_190 + iVar33 >> auVar42;
    iStack_18c = iStack_18c + iVar33 >> auVar42;
    local_188 = local_188 + iVar33 >> auVar42;
    iStack_184 = iStack_184 + iVar33 >> auVar42;
    iStack_180 = iStack_180 + iVar33 >> auVar42;
    iStack_17c = iStack_17c + iVar33 >> auVar42;
    local_178 = local_178 + iVar33 >> auVar42;
    iStack_174 = iStack_174 + iVar33 >> auVar42;
    iStack_170 = iStack_170 + iVar33 >> auVar42;
    iStack_16c = iStack_16c + iVar33 >> auVar42;
    local_168 = local_168 + iVar33 >> auVar42;
    iStack_164 = iStack_164 + iVar33 >> auVar42;
    iStack_160 = iStack_160 + iVar33 >> auVar42;
    iStack_38 = iStack_15c + iVar33 >> auVar42;
    local_158 = local_158 + iVar33 >> auVar42;
    iStack_154 = iStack_154 + iVar33 >> auVar42;
    iStack_150 = iStack_150 + iVar33 >> auVar42;
    iStack_14c = iStack_14c + iVar33 >> auVar42;
    local_148 = iVar33 + local_148 >> auVar42;
    iStack_144 = iVar33 + iStack_144 >> auVar42;
    iStack_140 = iVar33 + iStack_140 >> auVar42;
    iStack_34 = iVar33 + iStack_13c >> auVar42;
    local_138._4_4_ = local_218;
    local_138._0_4_ = local_238;
    uStack_130._4_4_ = local_1d8;
    uStack_130._0_4_ = local_1f8;
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    auVar24._4_8_ = local_f8._8_8_;
    auVar24._0_4_ = iStack_210;
    local_f8._0_8_ = auVar24._0_8_ << 0x20;
    local_f8._8_4_ = iStack_1f0;
    local_f8._12_4_ = iStack_1d0;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0._4_4_ = local_1c8;
    uStack_b0._0_4_ = local_1e8;
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    auVar25._4_8_ = uStack_70;
    auVar25._0_4_ = iStack_200;
    local_78 = auVar25._0_8_ << 0x20;
    uStack_70._0_4_ = iStack_1e0;
    uStack_70._4_4_ = iStack_1c0;
    iStack_50 = iStack_21c;
    iStack_4c = iStack_1fc;
    iStack_44 = iStack_1bc;
    local_48 = iStack_1dc;
    local_128._4_4_ = local_198;
    local_128._0_4_ = local_1b8;
    uStack_120._4_4_ = local_158;
    uStack_120._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_f8._4_4_ = iStack_154;
    local_f8._0_4_ = iStack_174;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    iStack_b4 = iStack_14c;
    local_b8 = iStack_16c;
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_78._4_4_ = iStack_144;
    local_78._0_4_ = iStack_164;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    iStack_40 = iStack_19c;
    iStack_3c = iStack_17c;
    goto LAB_00b38d71;
  case 9:
    iVar33 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar42 = *(undefined1 (*) [16])input;
    auVar43 = *(undefined1 (*) [16])(input + stride);
    auVar44 = *(undefined1 (*) [16])(input + stride * 2);
    auVar45 = *(undefined1 (*) [16])(input + stride * 3);
    auVar46 = *(undefined1 (*) [16])(input + stride * 4);
    auVar47 = *(undefined1 (*) [16])(input + stride * 5);
    auVar48 = *(undefined1 (*) [16])(input + stride * 6);
    auVar49 = *(undefined1 (*) [16])(input + stride * 7);
    auVar70 = pmovsxwd(in_XMM9,auVar42);
    uStack_130 = auVar42._8_8_;
    lVar27 = uStack_130;
    local_138._4_4_ = auVar70._4_4_;
    local_138._0_4_ = auVar70._0_4_ << iVar33;
    uStack_130._4_4_ = auVar42._12_4_;
    uVar28 = uStack_130._4_4_;
    uStack_130._0_4_ = auVar70._8_4_;
    uStack_130._4_4_ = auVar70._12_4_;
    auVar134._8_4_ = auVar42._8_4_;
    auVar134._0_8_ = lVar27;
    auVar134._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar134,auVar134);
    local_128._0_4_ = auVar42._0_4_ << iVar33;
    local_128._4_4_ = auVar42._4_4_;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd((undefined1  [16])_local_128,auVar43);
    local_118._0_4_ = auVar42._0_4_ << iVar33;
    local_118._4_4_ = auVar42._4_4_;
    local_118._8_4_ = auVar42._8_4_;
    local_118._12_4_ = auVar42._12_4_;
    auVar70 = pmovsxwd(local_118,auVar44);
    auVar122._8_4_ = auVar43._8_4_;
    auVar122._12_4_ = auVar43._12_4_;
    auVar122._0_8_ = auVar43._8_8_;
    auVar42 = pmovsxwd(auVar122,auVar122);
    local_108._8_8_ = auVar45._8_8_;
    uVar5 = local_108._8_8_;
    local_108._4_4_ = auVar42._4_4_;
    local_108._0_4_ = auVar42._0_4_ << iVar33;
    local_108._12_4_ = auVar45._12_4_;
    uVar28 = local_108._12_4_;
    local_108._8_4_ = auVar42._8_4_;
    local_108._12_4_ = auVar42._12_4_;
    local_f8._8_8_ = auVar46._8_8_;
    uVar6 = local_f8._8_8_;
    local_f8._4_4_ = auVar70._4_4_;
    local_f8._0_4_ = auVar70._0_4_ << iVar33;
    local_f8._12_4_ = auVar46._12_4_;
    uVar29 = local_f8._12_4_;
    local_f8._8_4_ = auVar70._8_4_;
    local_f8._12_4_ = auVar70._12_4_;
    auVar109._8_4_ = auVar44._8_4_;
    auVar109._12_4_ = auVar44._12_4_;
    auVar109._0_8_ = auVar44._8_8_;
    auVar42 = pmovsxwd(auVar109,auVar109);
    local_e8._0_4_ = auVar42._0_4_ << iVar33;
    local_e8._4_4_ = auVar42._4_4_;
    local_e8._8_4_ = auVar42._8_4_;
    local_e8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_e8,auVar45);
    local_d8._8_8_ = auVar48._8_8_;
    uVar7 = local_d8._8_8_;
    local_d8._4_4_ = auVar42._4_4_;
    local_d8._0_4_ = auVar42._0_4_ << iVar33;
    local_d8._12_4_ = auVar48._12_4_;
    uVar30 = local_d8._12_4_;
    local_d8._8_4_ = auVar42._8_4_;
    local_d8._12_4_ = auVar42._12_4_;
    auVar101._8_4_ = auVar45._8_4_;
    auVar101._0_8_ = uVar5;
    auVar101._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar101,auVar101);
    local_c8._0_4_ = auVar42._0_4_ << iVar33;
    local_c8._4_4_ = auVar42._4_4_;
    local_c8._8_4_ = auVar42._8_4_;
    local_c8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_c8,auVar46);
    iStack_b4 = auVar42._4_4_;
    local_b8 = auVar42._0_4_ << iVar33;
    uStack_b0._0_4_ = auVar42._8_4_;
    uStack_b0._4_4_ = auVar42._12_4_;
    auVar92._8_4_ = auVar46._8_4_;
    auVar92._0_8_ = uVar6;
    auVar92._12_4_ = uVar29;
    auVar42 = pmovsxwd(auVar92,auVar92);
    local_a8._0_4_ = auVar42._0_4_ << iVar33;
    local_a8._4_4_ = auVar42._4_4_;
    local_a8._8_4_ = auVar42._8_4_;
    local_a8._12_4_ = auVar42._12_4_;
    auVar43 = pmovsxwd(local_a8,auVar47);
    auVar82._8_4_ = auVar47._8_4_;
    auVar82._12_4_ = auVar47._12_4_;
    auVar82._0_8_ = auVar47._8_8_;
    auVar42 = pmovsxwd(auVar82,auVar82);
    local_98._0_4_ = auVar43._0_4_ << iVar33;
    local_98._4_4_ = auVar43._4_4_;
    local_98._8_4_ = auVar43._8_4_;
    local_98._12_4_ = auVar43._12_4_;
    auVar43 = pmovsxwd(local_98,auVar48);
    local_88._4_4_ = auVar42._4_4_;
    local_88._0_4_ = auVar42._0_4_ << iVar33;
    local_88._8_4_ = auVar42._8_4_;
    local_88._12_4_ = auVar42._12_4_;
    local_78._4_4_ = auVar43._4_4_;
    local_78._0_4_ = auVar43._0_4_ << iVar33;
    uStack_70._0_4_ = auVar43._8_4_;
    uStack_70._4_4_ = auVar43._12_4_;
    auVar67._8_4_ = auVar48._8_4_;
    auVar67._0_8_ = uVar7;
    auVar67._12_4_ = uVar30;
    auVar42 = pmovsxwd(auVar67,auVar67);
    local_68._0_4_ = auVar42._0_4_ << iVar33;
    local_68._4_4_ = auVar42._4_4_;
    local_68._8_4_ = auVar42._8_4_;
    local_68._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_68,auVar49);
    uStack_54 = auVar42._4_4_;
    local_58 = auVar42._0_4_ << iVar33;
    iStack_50 = auVar42._8_4_;
    iStack_4c = auVar42._12_4_;
    auVar40._8_4_ = auVar49._8_4_;
    auVar40._12_4_ = auVar49._12_4_;
    auVar40._0_8_ = auVar49._8_8_;
    auVar42 = pmovsxwd(auVar40,auVar40);
    iStack_44 = auVar42._4_4_;
    local_48 = auVar42._0_4_ << iVar33;
    iStack_40 = auVar42._8_4_;
    iStack_3c = auVar42._12_4_;
    idtx8x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,stride,2);
    iVar33 = 1 << (~piVar26[1] & 0x1fU);
    auVar42 = ZEXT416((uint)-(int)piVar26[1]);
    local_238 = local_238 + iVar33 >> auVar42;
    iStack_234 = iStack_234 + iVar33 >> auVar42;
    iStack_230 = iStack_230 + iVar33 >> auVar42;
    iStack_22c = iStack_22c + iVar33 >> auVar42;
    local_228 = local_228 + iVar33 >> auVar42;
    iStack_224 = iStack_224 + iVar33 >> auVar42;
    iStack_220 = iStack_220 + iVar33 >> auVar42;
    iStack_21c = iStack_21c + iVar33 >> auVar42;
    local_218 = local_218 + iVar33 >> auVar42;
    iStack_214 = iStack_214 + iVar33 >> auVar42;
    iStack_210 = iStack_210 + iVar33 >> auVar42;
    iStack_20c = iStack_20c + iVar33 >> auVar42;
    local_208 = local_208 + iVar33 >> auVar42;
    iStack_204 = iStack_204 + iVar33 >> auVar42;
    iStack_200 = iStack_200 + iVar33 >> auVar42;
    iStack_1fc = iStack_1fc + iVar33 >> auVar42;
    local_1f8 = local_1f8 + iVar33 >> auVar42;
    iStack_1f4 = iStack_1f4 + iVar33 >> auVar42;
    iStack_1f0 = iStack_1f0 + iVar33 >> auVar42;
    iStack_1ec = iStack_1ec + iVar33 >> auVar42;
    local_1e8 = local_1e8 + iVar33 >> auVar42;
    iStack_1e4 = iStack_1e4 + iVar33 >> auVar42;
    iStack_1e0 = iStack_1e0 + iVar33 >> auVar42;
    iStack_1dc = iStack_1dc + iVar33 >> auVar42;
    local_1d8 = local_1d8 + iVar33 >> auVar42;
    iStack_1d4 = iStack_1d4 + iVar33 >> auVar42;
    iStack_1d0 = iStack_1d0 + iVar33 >> auVar42;
    iStack_1cc = iStack_1cc + iVar33 >> auVar42;
    local_1c8 = local_1c8 + iVar33 >> auVar42;
    iStack_1c4 = iStack_1c4 + iVar33 >> auVar42;
    iStack_1c0 = iStack_1c0 + iVar33 >> auVar42;
    iStack_1bc = iStack_1bc + iVar33 >> auVar42;
    local_1b8 = local_1b8 + iVar33 >> auVar42;
    iStack_1b4 = iStack_1b4 + iVar33 >> auVar42;
    iStack_1b0 = iStack_1b0 + iVar33 >> auVar42;
    iStack_1ac = iStack_1ac + iVar33 >> auVar42;
    local_1a8 = local_1a8 + iVar33 >> auVar42;
    iStack_1a4 = iStack_1a4 + iVar33 >> auVar42;
    iStack_1a0 = iStack_1a0 + iVar33 >> auVar42;
    iStack_19c = iStack_19c + iVar33 >> auVar42;
    local_198 = local_198 + iVar33 >> auVar42;
    iStack_194 = iStack_194 + iVar33 >> auVar42;
    iStack_190 = iStack_190 + iVar33 >> auVar42;
    iStack_18c = iStack_18c + iVar33 >> auVar42;
    local_188 = local_188 + iVar33 >> auVar42;
    iStack_184 = iStack_184 + iVar33 >> auVar42;
    iStack_180 = iStack_180 + iVar33 >> auVar42;
    iStack_17c = iStack_17c + iVar33 >> auVar42;
    local_178 = local_178 + iVar33 >> auVar42;
    iStack_174 = iStack_174 + iVar33 >> auVar42;
    iStack_170 = iStack_170 + iVar33 >> auVar42;
    iStack_16c = iStack_16c + iVar33 >> auVar42;
    local_168 = local_168 + iVar33 >> auVar42;
    iStack_164 = iStack_164 + iVar33 >> auVar42;
    iStack_160 = iStack_160 + iVar33 >> auVar42;
    iStack_38 = iStack_15c + iVar33 >> auVar42;
    local_158 = local_158 + iVar33 >> auVar42;
    iStack_154 = iStack_154 + iVar33 >> auVar42;
    iStack_150 = iStack_150 + iVar33 >> auVar42;
    iStack_14c = iStack_14c + iVar33 >> auVar42;
    local_148 = iVar33 + local_148 >> auVar42;
    iStack_144 = iVar33 + iStack_144 >> auVar42;
    iStack_140 = iVar33 + iStack_140 >> auVar42;
    iStack_34 = iVar33 + iStack_13c >> auVar42;
    local_138._4_4_ = local_218;
    local_138._0_4_ = local_238;
    uStack_130._4_4_ = local_1d8;
    uStack_130._0_4_ = local_1f8;
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    auVar14._4_8_ = local_f8._8_8_;
    auVar14._0_4_ = iStack_210;
    local_f8._0_8_ = auVar14._0_8_ << 0x20;
    local_f8._8_4_ = iStack_1f0;
    local_f8._12_4_ = iStack_1d0;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0._4_4_ = local_1c8;
    uStack_b0._0_4_ = local_1e8;
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    auVar15._4_8_ = uStack_70;
    auVar15._0_4_ = iStack_200;
    local_78 = auVar15._0_8_ << 0x20;
    uStack_70._0_4_ = iStack_1e0;
    uStack_70._4_4_ = iStack_1c0;
    iStack_50 = iStack_21c;
    iStack_4c = iStack_1fc;
    iStack_44 = iStack_1bc;
    local_48 = iStack_1dc;
    local_128._4_4_ = local_198;
    local_128._0_4_ = local_1b8;
    uStack_120._4_4_ = local_158;
    uStack_120._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_f8._4_4_ = iStack_154;
    local_f8._0_4_ = iStack_174;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    iStack_b4 = iStack_14c;
    local_b8 = iStack_16c;
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_78._4_4_ = iStack_144;
    local_78._0_4_ = iStack_164;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    iStack_40 = iStack_19c;
    iStack_3c = iStack_17c;
    goto LAB_00b387e0;
  case 10:
    iVar33 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar42 = *(undefined1 (*) [16])input;
    auVar43 = *(undefined1 (*) [16])(input + stride);
    auVar44 = *(undefined1 (*) [16])(input + stride * 2);
    auVar45 = *(undefined1 (*) [16])(input + stride * 3);
    auVar46 = *(undefined1 (*) [16])(input + stride * 4);
    auVar47 = *(undefined1 (*) [16])(input + stride * 5);
    auVar48 = *(undefined1 (*) [16])(input + stride * 6);
    auVar70 = pmovsxwd(in_XMM9,auVar42);
    auVar49 = *(undefined1 (*) [16])(input + stride * 7);
    uStack_130 = auVar42._8_8_;
    lVar27 = uStack_130;
    local_138._4_4_ = auVar70._4_4_;
    local_138._0_4_ = auVar70._0_4_ << iVar33;
    uStack_130._4_4_ = auVar42._12_4_;
    uVar28 = uStack_130._4_4_;
    uStack_130._0_4_ = auVar70._8_4_;
    uStack_130._4_4_ = auVar70._12_4_;
    auVar127._8_4_ = auVar42._8_4_;
    auVar127._0_8_ = lVar27;
    auVar127._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar127,auVar127);
    local_128._0_4_ = auVar42._0_4_ << iVar33;
    local_128._4_4_ = auVar42._4_4_;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd((undefined1  [16])_local_128,auVar43);
    local_118._8_8_ = auVar44._8_8_;
    uVar5 = local_118._8_8_;
    local_118._4_4_ = auVar42._4_4_;
    local_118._0_4_ = auVar42._0_4_ << iVar33;
    local_118._12_4_ = auVar44._12_4_;
    uVar28 = local_118._12_4_;
    local_118._8_4_ = auVar42._8_4_;
    local_118._12_4_ = auVar42._12_4_;
    auVar118._8_4_ = auVar43._8_4_;
    auVar118._12_4_ = auVar43._12_4_;
    auVar118._0_8_ = auVar43._8_8_;
    auVar42 = pmovsxwd(auVar118,auVar118);
    local_108._0_4_ = auVar42._0_4_ << iVar33;
    local_108._4_4_ = auVar42._4_4_;
    local_108._8_4_ = auVar42._8_4_;
    local_108._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_108,auVar44);
    local_f8._8_8_ = auVar46._8_8_;
    uVar6 = local_f8._8_8_;
    local_f8._4_4_ = auVar42._4_4_;
    local_f8._0_4_ = auVar42._0_4_ << iVar33;
    local_f8._12_4_ = auVar46._12_4_;
    uVar29 = local_f8._12_4_;
    local_f8._8_4_ = auVar42._8_4_;
    local_f8._12_4_ = auVar42._12_4_;
    auVar106._8_4_ = auVar44._8_4_;
    auVar106._0_8_ = uVar5;
    auVar106._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar106,auVar106);
    local_e8._0_4_ = auVar42._0_4_ << iVar33;
    local_e8._4_4_ = auVar42._4_4_;
    local_e8._8_4_ = auVar42._8_4_;
    local_e8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_e8,auVar45);
    local_d8._0_4_ = auVar42._0_4_ << iVar33;
    local_d8._4_4_ = auVar42._4_4_;
    local_d8._8_4_ = auVar42._8_4_;
    local_d8._12_4_ = auVar42._12_4_;
    auVar43 = pmovsxwd(local_d8,auVar46);
    auVar97._8_4_ = auVar45._8_4_;
    auVar97._12_4_ = auVar45._12_4_;
    auVar97._0_8_ = auVar45._8_8_;
    auVar42 = pmovsxwd(auVar97,auVar97);
    local_c8._4_4_ = auVar42._4_4_;
    local_c8._0_4_ = auVar42._0_4_ << iVar33;
    local_c8._8_4_ = auVar42._8_4_;
    local_c8._12_4_ = auVar42._12_4_;
    iStack_b4 = auVar43._4_4_;
    local_b8 = auVar43._0_4_ << iVar33;
    uStack_b0._0_4_ = auVar43._8_4_;
    uStack_b0._4_4_ = auVar43._12_4_;
    auVar88._8_4_ = auVar46._8_4_;
    auVar88._0_8_ = uVar6;
    auVar88._12_4_ = uVar29;
    auVar42 = pmovsxwd(auVar88,auVar88);
    local_a8._0_4_ = auVar42._0_4_ << iVar33;
    local_a8._4_4_ = auVar42._4_4_;
    local_a8._8_4_ = auVar42._8_4_;
    local_a8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_a8,auVar47);
    local_98._4_4_ = auVar42._4_4_;
    local_98._0_4_ = auVar42._0_4_ << iVar33;
    local_98._8_4_ = auVar42._8_4_;
    local_98._12_4_ = auVar42._12_4_;
    auVar75._8_4_ = auVar47._8_4_;
    auVar75._12_4_ = auVar47._12_4_;
    auVar75._0_8_ = auVar47._8_8_;
    auVar42 = pmovsxwd(auVar75,auVar75);
    local_88._0_4_ = auVar42._0_4_ << iVar33;
    local_88._4_4_ = auVar42._4_4_;
    local_88._8_4_ = auVar42._8_4_;
    local_88._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_88,auVar48);
    local_78._4_4_ = auVar42._4_4_;
    local_78._0_4_ = auVar42._0_4_ << iVar33;
    uStack_70._0_4_ = auVar42._8_4_;
    uStack_70._4_4_ = auVar42._12_4_;
    auVar58._8_4_ = auVar48._8_4_;
    auVar58._12_4_ = auVar48._12_4_;
    auVar58._0_8_ = auVar48._8_8_;
    auVar42 = pmovsxwd(auVar58,auVar58);
    local_68._0_4_ = auVar42._0_4_ << iVar33;
    local_68._4_4_ = auVar42._4_4_;
    local_68._8_4_ = auVar42._8_4_;
    local_68._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_68,auVar49);
    auVar76._0_8_ = auVar49._8_8_;
    auVar76._8_4_ = auVar49._8_4_;
    auVar76._12_4_ = auVar49._12_4_;
    auVar43 = pmovsxwd(auVar76,auVar76);
    uStack_54 = auVar42._4_4_;
    local_58 = auVar42._0_4_ << iVar33;
    iStack_50 = auVar42._8_4_;
    iStack_4c = auVar42._12_4_;
    iStack_44 = auVar43._4_4_;
    local_48 = auVar43._0_4_ << iVar33;
    iStack_40 = auVar43._8_4_;
    iStack_3c = auVar43._12_4_;
    fdct4x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,0xd,2);
    fdct4x8_sse4_1((__m128i *)local_128,(__m128i *)&local_228,0xd,2);
    iVar33 = 1 << (~piVar26[1] & 0x1fU);
    auVar42 = ZEXT416((uint)-(int)piVar26[1]);
    local_238 = local_238 + iVar33 >> auVar42;
    iStack_234 = iStack_234 + iVar33 >> auVar42;
    iStack_230 = iStack_230 + iVar33 >> auVar42;
    iStack_22c = iStack_22c + iVar33 >> auVar42;
    local_228 = local_228 + iVar33 >> auVar42;
    iStack_224 = iStack_224 + iVar33 >> auVar42;
    iStack_220 = iStack_220 + iVar33 >> auVar42;
    iStack_21c = iStack_21c + iVar33 >> auVar42;
    local_218 = local_218 + iVar33 >> auVar42;
    iStack_214 = iStack_214 + iVar33 >> auVar42;
    iStack_210 = iStack_210 + iVar33 >> auVar42;
    iStack_20c = iStack_20c + iVar33 >> auVar42;
    local_208 = local_208 + iVar33 >> auVar42;
    iStack_204 = iStack_204 + iVar33 >> auVar42;
    iStack_200 = iStack_200 + iVar33 >> auVar42;
    iStack_1fc = iStack_1fc + iVar33 >> auVar42;
    local_1f8 = local_1f8 + iVar33 >> auVar42;
    iStack_1f4 = iStack_1f4 + iVar33 >> auVar42;
    iStack_1f0 = iStack_1f0 + iVar33 >> auVar42;
    iStack_1ec = iStack_1ec + iVar33 >> auVar42;
    local_1e8 = local_1e8 + iVar33 >> auVar42;
    iStack_1e4 = iStack_1e4 + iVar33 >> auVar42;
    iStack_1e0 = iStack_1e0 + iVar33 >> auVar42;
    iStack_1dc = iStack_1dc + iVar33 >> auVar42;
    local_1d8 = local_1d8 + iVar33 >> auVar42;
    iStack_1d4 = iStack_1d4 + iVar33 >> auVar42;
    iStack_1d0 = iStack_1d0 + iVar33 >> auVar42;
    iStack_1cc = iStack_1cc + iVar33 >> auVar42;
    local_1c8 = local_1c8 + iVar33 >> auVar42;
    iStack_1c4 = iStack_1c4 + iVar33 >> auVar42;
    iStack_1c0 = iStack_1c0 + iVar33 >> auVar42;
    iStack_1bc = iStack_1bc + iVar33 >> auVar42;
    local_1b8 = local_1b8 + iVar33 >> auVar42;
    iStack_1b4 = iStack_1b4 + iVar33 >> auVar42;
    iStack_1b0 = iStack_1b0 + iVar33 >> auVar42;
    iStack_1ac = iStack_1ac + iVar33 >> auVar42;
    local_1a8 = local_1a8 + iVar33 >> auVar42;
    iStack_1a4 = iStack_1a4 + iVar33 >> auVar42;
    iStack_1a0 = iStack_1a0 + iVar33 >> auVar42;
    iStack_19c = iStack_19c + iVar33 >> auVar42;
    local_198 = local_198 + iVar33 >> auVar42;
    iStack_194 = iStack_194 + iVar33 >> auVar42;
    iStack_190 = iStack_190 + iVar33 >> auVar42;
    iStack_18c = iStack_18c + iVar33 >> auVar42;
    local_188 = local_188 + iVar33 >> auVar42;
    iStack_184 = iStack_184 + iVar33 >> auVar42;
    iStack_180 = iStack_180 + iVar33 >> auVar42;
    iStack_17c = iStack_17c + iVar33 >> auVar42;
    local_178 = local_178 + iVar33 >> auVar42;
    iStack_174 = iStack_174 + iVar33 >> auVar42;
    iStack_170 = iStack_170 + iVar33 >> auVar42;
    iStack_16c = iStack_16c + iVar33 >> auVar42;
    local_168 = local_168 + iVar33 >> auVar42;
    iStack_164 = iStack_164 + iVar33 >> auVar42;
    iStack_160 = iStack_160 + iVar33 >> auVar42;
    iStack_38 = iStack_15c + iVar33 >> auVar42;
    local_158 = local_158 + iVar33 >> auVar42;
    iStack_154 = iStack_154 + iVar33 >> auVar42;
    iStack_150 = iStack_150 + iVar33 >> auVar42;
    iStack_14c = iStack_14c + iVar33 >> auVar42;
    local_148 = iVar33 + local_148 >> auVar42;
    iStack_144 = iVar33 + iStack_144 >> auVar42;
    iStack_140 = iVar33 + iStack_140 >> auVar42;
    iStack_34 = iVar33 + iStack_13c >> auVar42;
    local_138._4_4_ = local_218;
    local_138._0_4_ = local_238;
    uStack_130._4_4_ = local_1d8;
    uStack_130._0_4_ = local_1f8;
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    auVar22._4_8_ = local_f8._8_8_;
    auVar22._0_4_ = iStack_210;
    local_f8._0_8_ = auVar22._0_8_ << 0x20;
    local_f8._8_4_ = iStack_1f0;
    local_f8._12_4_ = iStack_1d0;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0._4_4_ = local_1c8;
    uStack_b0._0_4_ = local_1e8;
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    auVar23._4_8_ = uStack_70;
    auVar23._0_4_ = iStack_200;
    local_78 = auVar23._0_8_ << 0x20;
    uStack_70._0_4_ = iStack_1e0;
    uStack_70._4_4_ = iStack_1c0;
    iStack_50 = iStack_21c;
    iStack_4c = iStack_1fc;
    iStack_44 = iStack_1bc;
    local_48 = iStack_1dc;
    local_128._4_4_ = local_198;
    local_128._0_4_ = local_1b8;
    uStack_120._4_4_ = local_158;
    uStack_120._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_f8._4_4_ = iStack_154;
    local_f8._0_4_ = iStack_174;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    iStack_b4 = iStack_14c;
    local_b8 = iStack_16c;
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_78._4_4_ = iStack_144;
    local_78._0_4_ = iStack_164;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    iStack_40 = iStack_19c;
    iStack_3c = iStack_17c;
    goto LAB_00b387e0;
  case 0xb:
    iVar33 = (int)*av1_fwd_txfm_shift_ls[1];
    auVar42 = *(undefined1 (*) [16])input;
    auVar43 = *(undefined1 (*) [16])(input + stride);
    auVar44 = *(undefined1 (*) [16])(input + stride * 2);
    auVar45 = *(undefined1 (*) [16])(input + stride * 3);
    auVar46 = *(undefined1 (*) [16])(input + stride * 4);
    auVar47 = *(undefined1 (*) [16])(input + stride * 5);
    auVar48 = *(undefined1 (*) [16])(input + stride * 6);
    auVar70 = pmovsxwd(in_XMM9,auVar42);
    auVar49 = *(undefined1 (*) [16])(input + stride * 7);
    uStack_130 = auVar42._8_8_;
    lVar27 = uStack_130;
    local_138._4_4_ = auVar70._4_4_;
    local_138._0_4_ = auVar70._0_4_ << iVar33;
    uStack_130._4_4_ = auVar42._12_4_;
    uVar28 = uStack_130._4_4_;
    uStack_130._0_4_ = auVar70._8_4_;
    uStack_130._4_4_ = auVar70._12_4_;
    auVar120._8_4_ = auVar42._8_4_;
    auVar120._0_8_ = lVar27;
    auVar120._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar120,auVar120);
    local_128._0_4_ = auVar42._0_4_ << iVar33;
    local_128._4_4_ = auVar42._4_4_;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd((undefined1  [16])_local_128,auVar43);
    local_118._8_8_ = auVar44._8_8_;
    uVar5 = local_118._8_8_;
    local_118._4_4_ = auVar42._4_4_;
    local_118._0_4_ = auVar42._0_4_ << iVar33;
    local_118._12_4_ = auVar44._12_4_;
    uVar28 = local_118._12_4_;
    local_118._8_4_ = auVar42._8_4_;
    local_118._12_4_ = auVar42._12_4_;
    auVar113._8_4_ = auVar43._8_4_;
    auVar113._12_4_ = auVar43._12_4_;
    auVar113._0_8_ = auVar43._8_8_;
    auVar42 = pmovsxwd(auVar113,auVar113);
    local_108._0_4_ = auVar42._0_4_ << iVar33;
    local_108._4_4_ = auVar42._4_4_;
    local_108._8_4_ = auVar42._8_4_;
    local_108._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_108,auVar44);
    local_f8._8_8_ = auVar46._8_8_;
    uVar6 = local_f8._8_8_;
    local_f8._4_4_ = auVar42._4_4_;
    local_f8._0_4_ = auVar42._0_4_ << iVar33;
    local_f8._12_4_ = auVar46._12_4_;
    uVar29 = local_f8._12_4_;
    local_f8._8_4_ = auVar42._8_4_;
    local_f8._12_4_ = auVar42._12_4_;
    auVar99._8_4_ = auVar44._8_4_;
    auVar99._0_8_ = uVar5;
    auVar99._12_4_ = uVar28;
    auVar42 = pmovsxwd(auVar99,auVar99);
    local_e8._0_4_ = auVar42._0_4_ << iVar33;
    local_e8._4_4_ = auVar42._4_4_;
    local_e8._8_4_ = auVar42._8_4_;
    local_e8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_e8,auVar45);
    local_d8._0_4_ = auVar42._0_4_ << iVar33;
    local_d8._4_4_ = auVar42._4_4_;
    local_d8._8_4_ = auVar42._8_4_;
    local_d8._12_4_ = auVar42._12_4_;
    auVar43 = pmovsxwd(local_d8,auVar46);
    auVar91._8_4_ = auVar45._8_4_;
    auVar91._12_4_ = auVar45._12_4_;
    auVar91._0_8_ = auVar45._8_8_;
    auVar42 = pmovsxwd(auVar91,auVar91);
    local_c8._4_4_ = auVar42._4_4_;
    local_c8._0_4_ = auVar42._0_4_ << iVar33;
    local_c8._8_4_ = auVar42._8_4_;
    local_c8._12_4_ = auVar42._12_4_;
    iStack_b4 = auVar43._4_4_;
    local_b8 = auVar43._0_4_ << iVar33;
    uStack_b0._0_4_ = auVar43._8_4_;
    uStack_b0._4_4_ = auVar43._12_4_;
    auVar80._8_4_ = auVar46._8_4_;
    auVar80._0_8_ = uVar6;
    auVar80._12_4_ = uVar29;
    auVar42 = pmovsxwd(auVar80,auVar80);
    local_a8._0_4_ = auVar42._0_4_ << iVar33;
    local_a8._4_4_ = auVar42._4_4_;
    local_a8._8_4_ = auVar42._8_4_;
    local_a8._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_a8,auVar47);
    local_98._4_4_ = auVar42._4_4_;
    local_98._0_4_ = auVar42._0_4_ << iVar33;
    local_98._8_4_ = auVar42._8_4_;
    local_98._12_4_ = auVar42._12_4_;
    auVar62._8_4_ = auVar47._8_4_;
    auVar62._12_4_ = auVar47._12_4_;
    auVar62._0_8_ = auVar47._8_8_;
    auVar42 = pmovsxwd(auVar62,auVar62);
    local_88._0_4_ = auVar42._0_4_ << iVar33;
    local_88._4_4_ = auVar42._4_4_;
    local_88._8_4_ = auVar42._8_4_;
    local_88._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_88,auVar48);
    local_78._4_4_ = auVar42._4_4_;
    local_78._0_4_ = auVar42._0_4_ << iVar33;
    uStack_70._0_4_ = auVar42._8_4_;
    uStack_70._4_4_ = auVar42._12_4_;
    auVar36._8_4_ = auVar48._8_4_;
    auVar36._12_4_ = auVar48._12_4_;
    auVar36._0_8_ = auVar48._8_8_;
    auVar42 = pmovsxwd(auVar36,auVar36);
    local_68._0_4_ = auVar42._0_4_ << iVar33;
    local_68._4_4_ = auVar42._4_4_;
    local_68._8_4_ = auVar42._8_4_;
    local_68._12_4_ = auVar42._12_4_;
    auVar42 = pmovsxwd(local_68,auVar49);
    auVar63._0_8_ = auVar49._8_8_;
    auVar63._8_4_ = auVar49._8_4_;
    auVar63._12_4_ = auVar49._12_4_;
    auVar43 = pmovsxwd(auVar63,auVar63);
    uStack_54 = auVar42._4_4_;
    local_58 = auVar42._0_4_ << iVar33;
    iStack_50 = auVar42._8_4_;
    iStack_4c = auVar42._12_4_;
    iStack_44 = auVar43._4_4_;
    local_48 = auVar43._0_4_ << iVar33;
    iStack_40 = auVar43._8_4_;
    iStack_3c = auVar43._12_4_;
    idtx8x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,stride,2);
    iVar33 = 1 << (~piVar26[1] & 0x1fU);
    auVar42 = ZEXT416((uint)-(int)piVar26[1]);
    local_238 = local_238 + iVar33 >> auVar42;
    iStack_234 = iStack_234 + iVar33 >> auVar42;
    iStack_230 = iStack_230 + iVar33 >> auVar42;
    iStack_22c = iStack_22c + iVar33 >> auVar42;
    local_228 = local_228 + iVar33 >> auVar42;
    iStack_224 = iStack_224 + iVar33 >> auVar42;
    iStack_220 = iStack_220 + iVar33 >> auVar42;
    iStack_21c = iStack_21c + iVar33 >> auVar42;
    local_218 = local_218 + iVar33 >> auVar42;
    iStack_214 = iStack_214 + iVar33 >> auVar42;
    iStack_210 = iStack_210 + iVar33 >> auVar42;
    iStack_20c = iStack_20c + iVar33 >> auVar42;
    local_208 = local_208 + iVar33 >> auVar42;
    iStack_204 = iStack_204 + iVar33 >> auVar42;
    iStack_200 = iStack_200 + iVar33 >> auVar42;
    iStack_1fc = iStack_1fc + iVar33 >> auVar42;
    local_1f8 = local_1f8 + iVar33 >> auVar42;
    iStack_1f4 = iStack_1f4 + iVar33 >> auVar42;
    iStack_1f0 = iStack_1f0 + iVar33 >> auVar42;
    iStack_1ec = iStack_1ec + iVar33 >> auVar42;
    local_1e8 = local_1e8 + iVar33 >> auVar42;
    iStack_1e4 = iStack_1e4 + iVar33 >> auVar42;
    iStack_1e0 = iStack_1e0 + iVar33 >> auVar42;
    iStack_1dc = iStack_1dc + iVar33 >> auVar42;
    local_1d8 = local_1d8 + iVar33 >> auVar42;
    iStack_1d4 = iStack_1d4 + iVar33 >> auVar42;
    iStack_1d0 = iStack_1d0 + iVar33 >> auVar42;
    iStack_1cc = iStack_1cc + iVar33 >> auVar42;
    local_1c8 = local_1c8 + iVar33 >> auVar42;
    iStack_1c4 = iStack_1c4 + iVar33 >> auVar42;
    iStack_1c0 = iStack_1c0 + iVar33 >> auVar42;
    iStack_1bc = iStack_1bc + iVar33 >> auVar42;
    local_1b8 = local_1b8 + iVar33 >> auVar42;
    iStack_1b4 = iStack_1b4 + iVar33 >> auVar42;
    iStack_1b0 = iStack_1b0 + iVar33 >> auVar42;
    iStack_1ac = iStack_1ac + iVar33 >> auVar42;
    local_1a8 = local_1a8 + iVar33 >> auVar42;
    iStack_1a4 = iStack_1a4 + iVar33 >> auVar42;
    iStack_1a0 = iStack_1a0 + iVar33 >> auVar42;
    iStack_19c = iStack_19c + iVar33 >> auVar42;
    local_198 = local_198 + iVar33 >> auVar42;
    iStack_194 = iStack_194 + iVar33 >> auVar42;
    iStack_190 = iStack_190 + iVar33 >> auVar42;
    iStack_18c = iStack_18c + iVar33 >> auVar42;
    local_188 = local_188 + iVar33 >> auVar42;
    iStack_184 = iStack_184 + iVar33 >> auVar42;
    iStack_180 = iStack_180 + iVar33 >> auVar42;
    iStack_17c = iStack_17c + iVar33 >> auVar42;
    local_178 = local_178 + iVar33 >> auVar42;
    iStack_174 = iStack_174 + iVar33 >> auVar42;
    iStack_170 = iStack_170 + iVar33 >> auVar42;
    iStack_16c = iStack_16c + iVar33 >> auVar42;
    local_168 = local_168 + iVar33 >> auVar42;
    iStack_164 = iStack_164 + iVar33 >> auVar42;
    iStack_160 = iStack_160 + iVar33 >> auVar42;
    iStack_38 = iStack_15c + iVar33 >> auVar42;
    local_158 = local_158 + iVar33 >> auVar42;
    iStack_154 = iStack_154 + iVar33 >> auVar42;
    iStack_150 = iStack_150 + iVar33 >> auVar42;
    iStack_14c = iStack_14c + iVar33 >> auVar42;
    local_148 = iVar33 + local_148 >> auVar42;
    iStack_144 = iVar33 + iStack_144 >> auVar42;
    iStack_140 = iVar33 + iStack_140 >> auVar42;
    iStack_34 = iVar33 + iStack_13c >> auVar42;
    local_138._4_4_ = local_218;
    local_138._0_4_ = local_238;
    uStack_130._4_4_ = local_1d8;
    uStack_130._0_4_ = local_1f8;
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    auVar10._4_8_ = local_f8._8_8_;
    auVar10._0_4_ = iStack_210;
    local_f8._0_8_ = auVar10._0_8_ << 0x20;
    local_f8._8_4_ = iStack_1f0;
    local_f8._12_4_ = iStack_1d0;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0._4_4_ = local_1c8;
    uStack_b0._0_4_ = local_1e8;
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    auVar11._4_8_ = uStack_70;
    auVar11._0_4_ = iStack_200;
    local_78 = auVar11._0_8_ << 0x20;
    uStack_70._0_4_ = iStack_1e0;
    uStack_70._4_4_ = iStack_1c0;
    iStack_50 = iStack_21c;
    iStack_4c = iStack_1fc;
    iStack_44 = iStack_1bc;
    local_48 = iStack_1dc;
    local_128._4_4_ = local_198;
    local_128._0_4_ = local_1b8;
    uStack_120._4_4_ = local_158;
    uStack_120._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_f8._4_4_ = iStack_154;
    local_f8._0_4_ = iStack_174;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    iStack_b4 = iStack_14c;
    local_b8 = iStack_16c;
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_78._4_4_ = iStack_144;
    local_78._0_4_ = iStack_164;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    iStack_40 = iStack_19c;
    iStack_3c = iStack_17c;
    break;
  case 0xc:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    _local_138 = *(__m128i *)input;
    _local_128 = *(__m128i *)(input + stride);
    local_118 = *(undefined1 (*) [16])(input + stride * 2);
    auVar42 = *(undefined1 (*) [16])(input + stride * 3);
    auVar43 = *(undefined1 (*) [16])(input + stride * 4);
    auVar44 = *(undefined1 (*) [16])(input + stride * 5);
    auVar45 = *(undefined1 (*) [16])(input + stride * 6);
    auVar46 = *(undefined1 (*) [16])(input + stride * 7);
    goto LAB_00b35a48;
  case 0xd:
    iVar33 = (int)*av1_fwd_txfm_shift_ls[1];
    uVar5 = *(undefined8 *)(input + 4);
    uVar6 = *(undefined8 *)(*(undefined1 (*) [16])(input + stride) + 8);
    uVar7 = *(undefined8 *)(*(undefined1 (*) [16])(input + stride * 2) + 8);
    auVar42 = *(undefined1 (*) [16])(input + stride * 3);
    auVar43 = *(undefined1 (*) [16])(input + stride * 4);
    auVar44 = *(undefined1 (*) [16])(input + stride * 5);
    auVar45 = *(undefined1 (*) [16])(input + stride * 6);
    auVar46 = *(undefined1 (*) [16])(input + stride * 7);
    auVar115 = pmovsxwd(in_XMM6,auVar43);
    auVar70._8_4_ = auVar43._8_4_;
    auVar70._12_4_ = auVar43._12_4_;
    auVar70._0_8_ = auVar43._8_8_;
    auVar70 = pmovsxwd(in_XMM7,auVar70);
    auVar47 = pmovsxwd(in_XMM2,auVar44);
    auVar94._0_8_ = auVar44._8_8_;
    auVar94._8_4_ = auVar44._8_4_;
    auVar94._12_4_ = auVar44._12_4_;
    auVar49 = pmovsxwd(in_XMM5,auVar94);
    auVar48 = pmovsxwd(in_XMM3,auVar45);
    auVar103._0_8_ = auVar45._8_8_;
    auVar103._8_4_ = auVar45._8_4_;
    auVar103._12_4_ = auVar45._12_4_;
    auVar45 = pmovsxwd(auVar45,auVar103);
    auVar43 = pmovsxwd(auVar103,auVar46);
    auVar110._0_8_ = auVar46._8_8_;
    auVar110._8_4_ = auVar46._8_4_;
    auVar110._12_4_ = auVar46._12_4_;
    auVar44 = pmovsxwd(auVar110,auVar110);
    auVar46 = pmovsxwd(auVar46,auVar42);
    auVar124._8_4_ = auVar42._8_4_;
    auVar124._12_4_ = auVar42._12_4_;
    auVar124._0_8_ = auVar42._8_8_;
    auVar94 = pmovsxwd(in_XMM10,auVar124);
    auVar103 = pmovsxwd(in_XMM11,*(undefined1 (*) [16])(input + stride * 2));
    auVar145._8_4_ = (undefined4)uVar7;
    auVar145._12_4_ = (undefined4)((ulong)uVar7 >> 0x20);
    auVar145._0_8_ = uVar7;
    auVar110 = pmovsxwd(in_XMM12,auVar145);
    auVar124 = pmovsxwd(in_XMM13,*(undefined1 (*) [16])(input + stride));
    auVar146._8_4_ = (undefined4)uVar6;
    auVar146._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    auVar146._0_8_ = uVar6;
    auVar145 = pmovsxwd(in_XMM14,auVar146);
    auVar146 = pmovsxwd(in_XMM15,*(undefined1 (*) [16])input);
    auVar139._8_4_ = (undefined4)uVar5;
    auVar139._12_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    auVar139._0_8_ = uVar5;
    auVar42 = pmovsxwd(auVar43,auVar139);
    local_138._4_4_ = auVar146._4_4_;
    local_138._0_4_ = auVar146._0_4_ << iVar33;
    uStack_130._0_4_ = auVar146._8_4_;
    uStack_130._4_4_ = auVar146._12_4_;
    local_128._4_4_ = auVar42._4_4_;
    local_128._0_4_ = auVar42._0_4_ << iVar33;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    local_118._4_4_ = auVar124._4_4_;
    local_118._0_4_ = auVar124._0_4_ << iVar33;
    local_118._8_4_ = auVar124._8_4_;
    local_118._12_4_ = auVar124._12_4_;
    local_108._4_4_ = auVar145._4_4_;
    local_108._0_4_ = auVar145._0_4_ << iVar33;
    local_108._8_4_ = auVar145._8_4_;
    local_108._12_4_ = auVar145._12_4_;
    local_f8._4_4_ = auVar103._4_4_;
    local_f8._0_4_ = auVar103._0_4_ << iVar33;
    local_f8._8_4_ = auVar103._8_4_;
    local_f8._12_4_ = auVar103._12_4_;
    local_e8._4_4_ = auVar110._4_4_;
    local_e8._0_4_ = auVar110._0_4_ << iVar33;
    local_e8._8_4_ = auVar110._8_4_;
    local_e8._12_4_ = auVar110._12_4_;
    local_d8._4_4_ = auVar46._4_4_;
    local_d8._0_4_ = auVar46._0_4_ << iVar33;
    local_d8._8_4_ = auVar46._8_4_;
    local_d8._12_4_ = auVar46._12_4_;
    local_c8._4_4_ = auVar94._4_4_;
    local_c8._0_4_ = auVar94._0_4_ << iVar33;
    local_c8._8_4_ = auVar94._8_4_;
    local_c8._12_4_ = auVar94._12_4_;
    iStack_b4 = auVar115._4_4_;
    local_b8 = auVar115._0_4_ << iVar33;
    uStack_b0._0_4_ = auVar115._8_4_;
    uStack_b0._4_4_ = auVar115._12_4_;
    local_a8._4_4_ = auVar70._4_4_;
    local_a8._0_4_ = auVar70._0_4_ << iVar33;
    local_a8._8_4_ = auVar70._8_4_;
    local_a8._12_4_ = auVar70._12_4_;
    local_98._4_4_ = auVar47._4_4_;
    local_98._0_4_ = auVar47._0_4_ << iVar33;
    local_98._8_4_ = auVar47._8_4_;
    local_98._12_4_ = auVar47._12_4_;
    local_88._4_4_ = auVar49._4_4_;
    local_88._0_4_ = auVar49._0_4_ << iVar33;
    local_88._8_4_ = auVar49._8_4_;
    local_88._12_4_ = auVar49._12_4_;
    local_78._4_4_ = auVar48._4_4_;
    local_78._0_4_ = auVar48._0_4_ << iVar33;
    uStack_70._0_4_ = auVar48._8_4_;
    uStack_70._4_4_ = auVar48._12_4_;
    local_68._4_4_ = auVar45._4_4_;
    local_68._0_4_ = auVar45._0_4_ << iVar33;
    local_68._8_4_ = auVar45._8_4_;
    local_68._12_4_ = auVar45._12_4_;
    local_258 = auVar43._0_4_;
    uStack_254 = auVar43._4_4_;
    uStack_250 = auVar43._8_4_;
    uStack_24c = auVar43._12_4_;
    uStack_54 = uStack_254;
    local_58 = local_258 << iVar33;
    iStack_50 = uStack_250;
    iStack_4c = uStack_24c;
    iStack_44 = auVar44._4_4_;
    local_48 = auVar44._0_4_ << iVar33;
    iStack_40 = auVar44._8_4_;
    iStack_3c = auVar44._12_4_;
    goto LAB_00b37b73;
  case 0xe:
    cVar1 = *av1_fwd_txfm_shift_ls[1];
    _local_138 = *(__m128i *)(input + stride * 7);
    _local_128 = *(__m128i *)(input + stride * 6);
    local_118 = *(undefined1 (*) [16])(input + stride * 5);
    auVar42 = *(undefined1 (*) [16])(input + stride * 4);
    auVar43 = *(undefined1 (*) [16])(input + stride * 3);
    auVar44 = *(undefined1 (*) [16])(input + stride * 2);
    auVar45 = *(undefined1 (*) [16])(input + stride);
    auVar46 = *(undefined1 (*) [16])input;
LAB_00b35a48:
    iVar33 = (int)cVar1;
    auVar70 = pmovsxwd(in_XMM6,auVar43);
    auVar115._8_4_ = auVar43._8_4_;
    auVar115._12_4_ = auVar43._12_4_;
    auVar115._0_8_ = auVar43._8_8_;
    auVar94 = pmovsxwd(in_XMM7,auVar115);
    auVar47 = pmovsxwd(in_XMM2,auVar44);
    auVar38._0_8_ = auVar44._8_8_;
    auVar38._8_4_ = auVar44._8_4_;
    auVar38._12_4_ = auVar44._12_4_;
    auVar49 = pmovsxwd(in_XMM5,auVar38);
    auVar48 = pmovsxwd(in_XMM3,auVar45);
    auVar39._0_8_ = auVar45._8_8_;
    auVar39._8_4_ = auVar45._8_4_;
    auVar39._12_4_ = auVar45._12_4_;
    auVar45 = pmovsxwd(auVar45,auVar39);
    auVar43 = pmovsxwd(auVar39,auVar46);
    auVar66._0_8_ = auVar46._8_8_;
    auVar66._8_4_ = auVar46._8_4_;
    auVar66._12_4_ = auVar46._12_4_;
    auVar44 = pmovsxwd(auVar66,auVar66);
    auVar46 = pmovsxwd(auVar46,auVar42);
    auVar130._8_4_ = auVar42._8_4_;
    auVar130._12_4_ = auVar42._12_4_;
    auVar130._0_8_ = auVar42._8_8_;
    auVar103 = pmovsxwd(in_XMM10,auVar130);
    auVar110 = pmovsxwd(in_XMM11,local_118);
    auVar131._8_4_ = local_118._8_4_;
    auVar131._12_4_ = local_118._12_4_;
    auVar131._0_8_ = local_118._8_8_;
    auVar115 = pmovsxwd(in_XMM12,auVar131);
    auVar124 = pmovsxwd(in_XMM13,(undefined1  [16])_local_128);
    auVar132._8_4_ = local_128._8_4_;
    auVar132._12_4_ = local_128._12_4_;
    auVar132._0_8_ = local_128._8_8_;
    auVar145 = pmovsxwd(in_XMM14,auVar132);
    auVar146 = pmovsxwd(in_XMM15,(undefined1  [16])_local_138);
    auVar133._8_4_ = local_138._8_4_;
    auVar133._12_4_ = local_138._12_4_;
    auVar133._0_8_ = local_138._8_8_;
    auVar42 = pmovsxwd(auVar43,auVar133);
    local_138._4_4_ = auVar146._4_4_;
    local_138._0_4_ = auVar146._0_4_ << iVar33;
    uStack_130._0_4_ = auVar146._8_4_;
    uStack_130._4_4_ = auVar146._12_4_;
    local_128._4_4_ = auVar42._4_4_;
    local_128._0_4_ = auVar42._0_4_ << iVar33;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    local_118._4_4_ = auVar124._4_4_;
    local_118._0_4_ = auVar124._0_4_ << iVar33;
    local_118._8_4_ = auVar124._8_4_;
    local_118._12_4_ = auVar124._12_4_;
    local_108._4_4_ = auVar145._4_4_;
    local_108._0_4_ = auVar145._0_4_ << iVar33;
    local_108._8_4_ = auVar145._8_4_;
    local_108._12_4_ = auVar145._12_4_;
    local_f8._4_4_ = auVar110._4_4_;
    local_f8._0_4_ = auVar110._0_4_ << iVar33;
    local_f8._8_4_ = auVar110._8_4_;
    local_f8._12_4_ = auVar110._12_4_;
    local_e8._4_4_ = auVar115._4_4_;
    local_e8._0_4_ = auVar115._0_4_ << iVar33;
    local_e8._8_4_ = auVar115._8_4_;
    local_e8._12_4_ = auVar115._12_4_;
    local_d8._4_4_ = auVar46._4_4_;
    local_d8._0_4_ = auVar46._0_4_ << iVar33;
    local_d8._8_4_ = auVar46._8_4_;
    local_d8._12_4_ = auVar46._12_4_;
    local_c8._4_4_ = auVar103._4_4_;
    local_c8._0_4_ = auVar103._0_4_ << iVar33;
    local_c8._8_4_ = auVar103._8_4_;
    local_c8._12_4_ = auVar103._12_4_;
    iStack_b4 = auVar70._4_4_;
    local_b8 = auVar70._0_4_ << iVar33;
    uStack_b0._0_4_ = auVar70._8_4_;
    uStack_b0._4_4_ = auVar70._12_4_;
    local_a8._4_4_ = auVar94._4_4_;
    local_a8._0_4_ = auVar94._0_4_ << iVar33;
    local_a8._8_4_ = auVar94._8_4_;
    local_a8._12_4_ = auVar94._12_4_;
    local_98._4_4_ = auVar47._4_4_;
    local_98._0_4_ = auVar47._0_4_ << iVar33;
    local_98._8_4_ = auVar47._8_4_;
    local_98._12_4_ = auVar47._12_4_;
    local_88._4_4_ = auVar49._4_4_;
    local_88._0_4_ = auVar49._0_4_ << iVar33;
    local_88._8_4_ = auVar49._8_4_;
    local_88._12_4_ = auVar49._12_4_;
    local_78._4_4_ = auVar48._4_4_;
    local_78._0_4_ = auVar48._0_4_ << iVar33;
    uStack_70._0_4_ = auVar48._8_4_;
    uStack_70._4_4_ = auVar48._12_4_;
    local_68._4_4_ = auVar45._4_4_;
    local_68._0_4_ = auVar45._0_4_ << iVar33;
    local_68._8_4_ = auVar45._8_4_;
    local_68._12_4_ = auVar45._12_4_;
    local_258 = auVar43._0_4_;
    uStack_254 = auVar43._4_4_;
    uStack_250 = auVar43._8_4_;
    uStack_24c = auVar43._12_4_;
    uStack_54 = uStack_254;
    local_58 = local_258 << iVar33;
    iStack_50 = uStack_250;
    iStack_4c = uStack_24c;
    iStack_44 = auVar44._4_4_;
    local_48 = auVar44._0_4_ << iVar33;
    iStack_40 = auVar44._8_4_;
    iStack_3c = auVar44._12_4_;
    fadst8x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,0xd,2);
    iVar33 = 1 << (~piVar26[1] & 0x1fU);
    auVar42 = ZEXT416((uint)-(int)piVar26[1]);
    local_238 = local_238 + iVar33 >> auVar42;
    iStack_234 = iStack_234 + iVar33 >> auVar42;
    iStack_230 = iStack_230 + iVar33 >> auVar42;
    iStack_22c = iStack_22c + iVar33 >> auVar42;
    local_228 = local_228 + iVar33 >> auVar42;
    iStack_224 = iStack_224 + iVar33 >> auVar42;
    iStack_220 = iStack_220 + iVar33 >> auVar42;
    iStack_21c = iStack_21c + iVar33 >> auVar42;
    local_218 = local_218 + iVar33 >> auVar42;
    iStack_214 = iStack_214 + iVar33 >> auVar42;
    iStack_210 = iStack_210 + iVar33 >> auVar42;
    iStack_20c = iStack_20c + iVar33 >> auVar42;
    local_208 = local_208 + iVar33 >> auVar42;
    iStack_204 = iStack_204 + iVar33 >> auVar42;
    iStack_200 = iStack_200 + iVar33 >> auVar42;
    iStack_1fc = iStack_1fc + iVar33 >> auVar42;
    local_1f8 = local_1f8 + iVar33 >> auVar42;
    iStack_1f4 = iStack_1f4 + iVar33 >> auVar42;
    iStack_1f0 = iStack_1f0 + iVar33 >> auVar42;
    iStack_1ec = iStack_1ec + iVar33 >> auVar42;
    local_1e8 = local_1e8 + iVar33 >> auVar42;
    iStack_1e4 = iStack_1e4 + iVar33 >> auVar42;
    iStack_1e0 = iStack_1e0 + iVar33 >> auVar42;
    iStack_1dc = iStack_1dc + iVar33 >> auVar42;
    local_1d8 = local_1d8 + iVar33 >> auVar42;
    iStack_1d4 = iStack_1d4 + iVar33 >> auVar42;
    iStack_1d0 = iStack_1d0 + iVar33 >> auVar42;
    iStack_1cc = iStack_1cc + iVar33 >> auVar42;
    local_1c8 = local_1c8 + iVar33 >> auVar42;
    iStack_1c4 = iStack_1c4 + iVar33 >> auVar42;
    iStack_1c0 = iStack_1c0 + iVar33 >> auVar42;
    iStack_1bc = iStack_1bc + iVar33 >> auVar42;
    local_1b8 = local_1b8 + iVar33 >> auVar42;
    iStack_1b4 = iStack_1b4 + iVar33 >> auVar42;
    iStack_1b0 = iStack_1b0 + iVar33 >> auVar42;
    iStack_1ac = iStack_1ac + iVar33 >> auVar42;
    local_1a8 = local_1a8 + iVar33 >> auVar42;
    iStack_1a4 = iStack_1a4 + iVar33 >> auVar42;
    iStack_1a0 = iStack_1a0 + iVar33 >> auVar42;
    iStack_19c = iStack_19c + iVar33 >> auVar42;
    local_198 = local_198 + iVar33 >> auVar42;
    iStack_194 = iStack_194 + iVar33 >> auVar42;
    iStack_190 = iStack_190 + iVar33 >> auVar42;
    iStack_18c = iStack_18c + iVar33 >> auVar42;
    local_188 = local_188 + iVar33 >> auVar42;
    iStack_184 = iStack_184 + iVar33 >> auVar42;
    iStack_180 = iStack_180 + iVar33 >> auVar42;
    iStack_17c = iStack_17c + iVar33 >> auVar42;
    local_178 = local_178 + iVar33 >> auVar42;
    iStack_174 = iStack_174 + iVar33 >> auVar42;
    iStack_170 = iStack_170 + iVar33 >> auVar42;
    iStack_16c = iStack_16c + iVar33 >> auVar42;
    local_168 = local_168 + iVar33 >> auVar42;
    iStack_164 = iStack_164 + iVar33 >> auVar42;
    iStack_160 = iStack_160 + iVar33 >> auVar42;
    iStack_38 = iStack_15c + iVar33 >> auVar42;
    local_158 = local_158 + iVar33 >> auVar42;
    iStack_154 = iStack_154 + iVar33 >> auVar42;
    iStack_150 = iStack_150 + iVar33 >> auVar42;
    iStack_14c = iStack_14c + iVar33 >> auVar42;
    local_148 = iVar33 + local_148 >> auVar42;
    iStack_144 = iVar33 + iStack_144 >> auVar42;
    iStack_140 = iVar33 + iStack_140 >> auVar42;
    iStack_34 = iVar33 + iStack_13c >> auVar42;
    local_138._4_4_ = local_218;
    local_138._0_4_ = local_238;
    uStack_130._4_4_ = local_1d8;
    uStack_130._0_4_ = local_1f8;
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    auVar12._4_8_ = local_f8._8_8_;
    auVar12._0_4_ = iStack_210;
    local_f8._0_8_ = auVar12._0_8_ << 0x20;
    local_f8._8_4_ = iStack_1f0;
    local_f8._12_4_ = iStack_1d0;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0._4_4_ = local_1c8;
    uStack_b0._0_4_ = local_1e8;
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    auVar13._4_8_ = uStack_70;
    auVar13._0_4_ = iStack_200;
    local_78 = auVar13._0_8_ << 0x20;
    uStack_70._0_4_ = iStack_1e0;
    uStack_70._4_4_ = iStack_1c0;
    iStack_50 = iStack_21c;
    iStack_4c = iStack_1fc;
    iStack_44 = iStack_1bc;
    local_48 = iStack_1dc;
    local_128._4_4_ = local_198;
    local_128._0_4_ = local_1b8;
    uStack_120._4_4_ = local_158;
    uStack_120._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_f8._4_4_ = iStack_154;
    local_f8._0_4_ = iStack_174;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    iStack_b4 = iStack_14c;
    local_b8 = iStack_16c;
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_78._4_4_ = iStack_144;
    local_78._0_4_ = iStack_164;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    iStack_40 = iStack_19c;
    iStack_3c = iStack_17c;
LAB_00b387e0:
    iStack_15c = iStack_38;
    iStack_13c = iStack_34;
    idtx8x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,iVar33,2);
    goto LAB_00b38d7b;
  case 0xf:
    iVar31 = (int)*av1_fwd_txfm_shift_ls[1];
    lVar32 = (long)stride;
    iVar4 = stride * 2;
    iVar33 = stride * 3;
    iVar34 = stride * 4;
    iVar2 = stride * 5;
    iVar3 = stride * 6;
    stride = stride * 7;
    auVar42 = pshufb(*(undefined1 (*) [16])input,_DAT_00dcc090);
    auVar43 = pshufb(*(undefined1 (*) [16])(input + lVar32),_DAT_00dcc090);
    auVar44 = pshufb(*(undefined1 (*) [16])(input + iVar4),_DAT_00dcc090);
    auVar45 = pshufb(*(undefined1 (*) [16])(input + iVar33),_DAT_00dcc090);
    auVar46 = pshufb(*(undefined1 (*) [16])(input + iVar34),_DAT_00dcc090);
    auVar47 = pshufb(*(undefined1 (*) [16])(input + iVar2),_DAT_00dcc090);
    auVar48 = pshufb(*(undefined1 (*) [16])(input + iVar3),_DAT_00dcc090);
    auVar49 = pshufb(*(undefined1 (*) [16])(input + stride),_DAT_00dcc090);
    auVar115 = pmovsxwd(in_XMM6,auVar46);
    auVar46._0_8_ = auVar46._8_8_;
    auVar124 = pmovsxwd(in_XMM7,auVar46);
    auVar70 = pmovsxwd(_DAT_00dcc090,auVar47);
    auVar47._0_8_ = auVar47._8_8_;
    auVar94 = pmovsxwd(in_XMM3,auVar47);
    auVar103 = pmovsxwd(in_XMM4,auVar48);
    auVar48._0_8_ = auVar48._8_8_;
    auVar110 = pmovsxwd(in_XMM5,auVar48);
    auVar46 = pmovsxwd(auVar48,auVar49);
    auVar49._0_8_ = auVar49._8_8_;
    auVar47 = pmovsxwd(auVar49,auVar49);
    auVar48 = pmovsxwd(in_XMM9,auVar45);
    auVar45._0_8_ = auVar45._8_8_;
    auVar45 = pmovsxwd(in_XMM10,auVar45);
    auVar49 = pmovsxwd(in_XMM11,auVar44);
    auVar44._0_8_ = auVar44._8_8_;
    auVar44 = pmovsxwd(in_XMM12,auVar44);
    auVar145 = pmovsxwd(in_XMM13,auVar43);
    auVar43._0_8_ = auVar43._8_8_;
    auVar43 = pmovsxwd(in_XMM14,auVar43);
    auVar146 = pmovsxwd(in_XMM15,auVar42);
    auVar42._0_8_ = auVar42._8_8_;
    auVar42 = pmovsxwd(auVar46,auVar42);
    local_138._4_4_ = auVar146._4_4_;
    local_138._0_4_ = auVar146._0_4_ << iVar31;
    uStack_130._0_4_ = auVar146._8_4_;
    uStack_130._4_4_ = auVar146._12_4_;
    local_128._4_4_ = auVar42._4_4_;
    local_128._0_4_ = auVar42._0_4_ << iVar31;
    uStack_120._0_4_ = auVar42._8_4_;
    uStack_120._4_4_ = auVar42._12_4_;
    local_118._4_4_ = auVar145._4_4_;
    local_118._0_4_ = auVar145._0_4_ << iVar31;
    local_118._8_4_ = auVar145._8_4_;
    local_118._12_4_ = auVar145._12_4_;
    local_108._4_4_ = auVar43._4_4_;
    local_108._0_4_ = auVar43._0_4_ << iVar31;
    local_108._8_4_ = auVar43._8_4_;
    local_108._12_4_ = auVar43._12_4_;
    local_f8._4_4_ = auVar49._4_4_;
    local_f8._0_4_ = auVar49._0_4_ << iVar31;
    local_f8._8_4_ = auVar49._8_4_;
    local_f8._12_4_ = auVar49._12_4_;
    local_e8._4_4_ = auVar44._4_4_;
    local_e8._0_4_ = auVar44._0_4_ << iVar31;
    local_e8._8_4_ = auVar44._8_4_;
    local_e8._12_4_ = auVar44._12_4_;
    local_d8._4_4_ = auVar48._4_4_;
    local_d8._0_4_ = auVar48._0_4_ << iVar31;
    local_d8._8_4_ = auVar48._8_4_;
    local_d8._12_4_ = auVar48._12_4_;
    local_c8._4_4_ = auVar45._4_4_;
    local_c8._0_4_ = auVar45._0_4_ << iVar31;
    local_c8._8_4_ = auVar45._8_4_;
    local_c8._12_4_ = auVar45._12_4_;
    iStack_b4 = auVar115._4_4_;
    local_b8 = auVar115._0_4_ << iVar31;
    uStack_b0._0_4_ = auVar115._8_4_;
    uStack_b0._4_4_ = auVar115._12_4_;
    local_a8._4_4_ = auVar124._4_4_;
    local_a8._0_4_ = auVar124._0_4_ << iVar31;
    local_a8._8_4_ = auVar124._8_4_;
    local_a8._12_4_ = auVar124._12_4_;
    local_98._4_4_ = auVar70._4_4_;
    local_98._0_4_ = auVar70._0_4_ << iVar31;
    local_98._8_4_ = auVar70._8_4_;
    local_98._12_4_ = auVar70._12_4_;
    local_88._4_4_ = auVar94._4_4_;
    local_88._0_4_ = auVar94._0_4_ << iVar31;
    local_88._8_4_ = auVar94._8_4_;
    local_88._12_4_ = auVar94._12_4_;
    local_78._4_4_ = auVar103._4_4_;
    local_78._0_4_ = auVar103._0_4_ << iVar31;
    uStack_70._0_4_ = auVar103._8_4_;
    uStack_70._4_4_ = auVar103._12_4_;
    local_68._4_4_ = auVar110._4_4_;
    local_68._0_4_ = auVar110._0_4_ << iVar31;
    local_68._8_4_ = auVar110._8_4_;
    local_68._12_4_ = auVar110._12_4_;
    local_258 = auVar46._0_4_;
    uStack_254 = auVar46._4_4_;
    uStack_250 = auVar46._8_4_;
    uStack_24c = auVar46._12_4_;
    uStack_54 = uStack_254;
    local_58 = local_258 << iVar31;
    iStack_50 = uStack_250;
    iStack_4c = uStack_24c;
    iStack_44 = auVar47._4_4_;
    local_48 = auVar47._0_4_ << iVar31;
    iStack_40 = auVar47._8_4_;
    iStack_3c = auVar47._12_4_;
LAB_00b37b73:
    idtx8x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,stride,2);
    iVar33 = 1 << (~piVar26[1] & 0x1fU);
    auVar42 = ZEXT416((uint)-(int)piVar26[1]);
    local_238 = local_238 + iVar33 >> auVar42;
    iStack_234 = iStack_234 + iVar33 >> auVar42;
    iStack_230 = iStack_230 + iVar33 >> auVar42;
    iStack_22c = iStack_22c + iVar33 >> auVar42;
    local_228 = local_228 + iVar33 >> auVar42;
    iStack_224 = iStack_224 + iVar33 >> auVar42;
    iStack_220 = iStack_220 + iVar33 >> auVar42;
    iStack_21c = iStack_21c + iVar33 >> auVar42;
    local_218 = local_218 + iVar33 >> auVar42;
    iStack_214 = iStack_214 + iVar33 >> auVar42;
    iStack_210 = iStack_210 + iVar33 >> auVar42;
    iStack_20c = iStack_20c + iVar33 >> auVar42;
    local_208 = local_208 + iVar33 >> auVar42;
    iStack_204 = iStack_204 + iVar33 >> auVar42;
    iStack_200 = iStack_200 + iVar33 >> auVar42;
    iStack_1fc = iStack_1fc + iVar33 >> auVar42;
    local_1f8 = local_1f8 + iVar33 >> auVar42;
    iStack_1f4 = iStack_1f4 + iVar33 >> auVar42;
    iStack_1f0 = iStack_1f0 + iVar33 >> auVar42;
    iStack_1ec = iStack_1ec + iVar33 >> auVar42;
    local_1e8 = local_1e8 + iVar33 >> auVar42;
    iStack_1e4 = iStack_1e4 + iVar33 >> auVar42;
    iStack_1e0 = iStack_1e0 + iVar33 >> auVar42;
    iStack_1dc = iStack_1dc + iVar33 >> auVar42;
    local_1d8 = local_1d8 + iVar33 >> auVar42;
    iStack_1d4 = iStack_1d4 + iVar33 >> auVar42;
    iStack_1d0 = iStack_1d0 + iVar33 >> auVar42;
    iStack_1cc = iStack_1cc + iVar33 >> auVar42;
    local_1c8 = local_1c8 + iVar33 >> auVar42;
    iStack_1c4 = iStack_1c4 + iVar33 >> auVar42;
    iStack_1c0 = iStack_1c0 + iVar33 >> auVar42;
    iStack_1bc = iStack_1bc + iVar33 >> auVar42;
    local_1b8 = local_1b8 + iVar33 >> auVar42;
    iStack_1b4 = iStack_1b4 + iVar33 >> auVar42;
    iStack_1b0 = iStack_1b0 + iVar33 >> auVar42;
    iStack_1ac = iStack_1ac + iVar33 >> auVar42;
    local_1a8 = local_1a8 + iVar33 >> auVar42;
    iStack_1a4 = iStack_1a4 + iVar33 >> auVar42;
    iStack_1a0 = iStack_1a0 + iVar33 >> auVar42;
    iStack_19c = iStack_19c + iVar33 >> auVar42;
    local_198 = local_198 + iVar33 >> auVar42;
    iStack_194 = iStack_194 + iVar33 >> auVar42;
    iStack_190 = iStack_190 + iVar33 >> auVar42;
    iStack_18c = iStack_18c + iVar33 >> auVar42;
    local_188 = local_188 + iVar33 >> auVar42;
    iStack_184 = iStack_184 + iVar33 >> auVar42;
    iStack_180 = iStack_180 + iVar33 >> auVar42;
    iStack_17c = iStack_17c + iVar33 >> auVar42;
    local_178 = local_178 + iVar33 >> auVar42;
    iStack_174 = iStack_174 + iVar33 >> auVar42;
    iStack_170 = iStack_170 + iVar33 >> auVar42;
    iStack_16c = iStack_16c + iVar33 >> auVar42;
    local_168 = local_168 + iVar33 >> auVar42;
    iStack_164 = iStack_164 + iVar33 >> auVar42;
    iStack_160 = iStack_160 + iVar33 >> auVar42;
    iStack_38 = iStack_15c + iVar33 >> auVar42;
    local_158 = local_158 + iVar33 >> auVar42;
    iStack_154 = iStack_154 + iVar33 >> auVar42;
    iStack_150 = iStack_150 + iVar33 >> auVar42;
    iStack_14c = iStack_14c + iVar33 >> auVar42;
    local_148 = iVar33 + local_148 >> auVar42;
    iStack_144 = iVar33 + iStack_144 >> auVar42;
    iStack_140 = iVar33 + iStack_140 >> auVar42;
    iStack_34 = iVar33 + iStack_13c >> auVar42;
    local_138._4_4_ = local_218;
    local_138._0_4_ = local_238;
    uStack_130._4_4_ = local_1d8;
    uStack_130._0_4_ = local_1f8;
    local_118._8_4_ = iStack_234;
    local_118._12_4_ = iStack_214;
    local_108._4_4_ = iStack_1d4;
    local_108._0_4_ = iStack_1f4;
    auVar20._4_8_ = local_f8._8_8_;
    auVar20._0_4_ = iStack_210;
    local_f8._0_8_ = auVar20._0_8_ << 0x20;
    local_f8._8_4_ = iStack_1f0;
    local_f8._12_4_ = iStack_1d0;
    local_d8._8_4_ = iStack_22c;
    local_d8._12_4_ = iStack_20c;
    local_c8._4_4_ = iStack_1cc;
    local_c8._0_4_ = iStack_1ec;
    uStack_b0._4_4_ = local_1c8;
    uStack_b0._0_4_ = local_1e8;
    local_98._8_4_ = iStack_224;
    local_98._12_4_ = iStack_204;
    local_88._4_4_ = iStack_1c4;
    local_88._0_4_ = iStack_1e4;
    auVar21._4_8_ = uStack_70;
    auVar21._0_4_ = iStack_200;
    local_78 = auVar21._0_8_ << 0x20;
    uStack_70._0_4_ = iStack_1e0;
    uStack_70._4_4_ = iStack_1c0;
    iStack_50 = iStack_21c;
    iStack_4c = iStack_1fc;
    iStack_44 = iStack_1bc;
    local_48 = iStack_1dc;
    local_128._4_4_ = local_198;
    local_128._0_4_ = local_1b8;
    uStack_120._4_4_ = local_158;
    uStack_120._0_4_ = local_178;
    local_108._8_4_ = iStack_1b4;
    local_108._12_4_ = iStack_194;
    local_f8._4_4_ = iStack_154;
    local_f8._0_4_ = iStack_174;
    local_e8._4_4_ = iStack_190;
    local_e8._0_4_ = iStack_1b0;
    local_e8._8_4_ = iStack_170;
    local_e8._12_4_ = iStack_150;
    local_c8._8_4_ = iStack_1ac;
    local_c8._12_4_ = iStack_18c;
    iStack_b4 = iStack_14c;
    local_b8 = iStack_16c;
    local_a8._4_4_ = local_188;
    local_a8._0_4_ = local_1a8;
    local_a8._12_4_ = local_148;
    local_a8._8_4_ = local_168;
    local_88._8_4_ = iStack_1a4;
    local_88._12_4_ = iStack_184;
    local_78._4_4_ = iStack_144;
    local_78._0_4_ = iStack_164;
    local_68._4_4_ = iStack_180;
    local_68._0_4_ = iStack_1a0;
    local_68._8_4_ = iStack_160;
    local_68._12_4_ = iStack_140;
    iStack_40 = iStack_19c;
    iStack_3c = iStack_17c;
    goto LAB_00b38d71;
  default:
    goto switchD_00b34c65_default;
  }
  iStack_15c = iStack_38;
  iStack_13c = iStack_34;
  fdct4x8_sse4_1((__m128i *)local_138,(__m128i *)&local_238,0xd,2);
  fdct4x8_sse4_1((__m128i *)local_128,(__m128i *)&local_228,0xd,2);
LAB_00b38d7b:
  *(ulong *)coeff = CONCAT44(iStack_234,local_238);
  *(ulong *)(coeff + 2) = CONCAT44(iStack_22c,iStack_230);
  *(ulong *)(coeff + 4) = CONCAT44(iStack_224,local_228);
  *(ulong *)(coeff + 6) = CONCAT44(iStack_21c,iStack_220);
  *(ulong *)(coeff + 8) = CONCAT44(iStack_214,local_218);
  *(ulong *)(coeff + 10) = CONCAT44(iStack_20c,iStack_210);
  *(ulong *)(coeff + 0xc) = CONCAT44(iStack_204,local_208);
  *(ulong *)(coeff + 0xe) = CONCAT44(iStack_1fc,iStack_200);
  *(ulong *)(coeff + 0x10) = CONCAT44(iStack_1f4,local_1f8);
  *(ulong *)(coeff + 0x12) = CONCAT44(iStack_1ec,iStack_1f0);
  *(ulong *)(coeff + 0x14) = CONCAT44(iStack_1e4,local_1e8);
  *(ulong *)(coeff + 0x16) = CONCAT44(iStack_1dc,iStack_1e0);
  *(ulong *)(coeff + 0x18) = CONCAT44(iStack_1d4,local_1d8);
  *(ulong *)(coeff + 0x1a) = CONCAT44(iStack_1cc,iStack_1d0);
  *(ulong *)(coeff + 0x1c) = CONCAT44(iStack_1c4,local_1c8);
  *(ulong *)(coeff + 0x1e) = CONCAT44(iStack_1bc,iStack_1c0);
  *(ulong *)(coeff + 0x20) = CONCAT44(iStack_1b4,local_1b8);
  *(ulong *)(coeff + 0x22) = CONCAT44(iStack_1ac,iStack_1b0);
  *(ulong *)(coeff + 0x24) = CONCAT44(iStack_1a4,local_1a8);
  *(ulong *)(coeff + 0x26) = CONCAT44(iStack_19c,iStack_1a0);
  *(ulong *)(coeff + 0x28) = CONCAT44(iStack_194,local_198);
  *(ulong *)(coeff + 0x2a) = CONCAT44(iStack_18c,iStack_190);
  *(ulong *)(coeff + 0x2c) = CONCAT44(iStack_184,local_188);
  *(ulong *)(coeff + 0x2e) = CONCAT44(iStack_17c,iStack_180);
  *(ulong *)(coeff + 0x30) = CONCAT44(iStack_174,local_178);
  *(ulong *)(coeff + 0x32) = CONCAT44(iStack_16c,iStack_170);
  *(ulong *)(coeff + 0x34) = CONCAT44(iStack_164,local_168);
  *(ulong *)(coeff + 0x36) = CONCAT44(iStack_15c,iStack_160);
  *(ulong *)(coeff + 0x38) = CONCAT44(iStack_154,local_158);
  *(ulong *)(coeff + 0x3a) = CONCAT44(iStack_14c,iStack_150);
  *(ulong *)(coeff + 0x3c) = CONCAT44(iStack_144,local_148);
  *(ulong *)(coeff + 0x3e) = CONCAT44(iStack_13c,iStack_140);
switchD_00b34c65_default:
  return;
}

Assistant:

void av1_fwd_txfm2d_8x8_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X8];
  const int txw_idx = get_txw_idx(TX_8X8);
  const int txh_idx = get_txh_idx(TX_8X8);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case DCT_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_8x8(input, in, stride, 1, 1, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case IDTX:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_FLIPADST:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}